

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  bool bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  int iVar93;
  undefined4 uVar94;
  vint4 bi_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  vint4 bi_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  vint4 bi;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  vfloat4 a0;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vint4 ai_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vint4 ai;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar182;
  float fVar183;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar184;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar218;
  float fVar219;
  vfloat4 a0_3;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar220;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  vfloat4 b0_2;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_4;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  __m128 a_2;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  int iVar262;
  undefined1 in_ZMM30 [64];
  undefined1 auVar263 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_379;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  int local_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  long local_2c0;
  ulong local_2b8;
  Primitive *local_2b0;
  RTCFilterFunctionNArguments local_2a8;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint auStack_158 [4];
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_13c;
  undefined4 local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint uStack_b8;
  float afStack_b4 [7];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar244 [32];
  
  PVar5 = prim[1];
  uVar25 = (ulong)(byte)PVar5;
  lVar32 = uVar25 * 0x25;
  fVar223 = *(float *)(prim + lVar32 + 0x12);
  auVar41 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar32 + 6));
  auVar51._0_4_ = fVar223 * (ray->dir).field_0.m128[0];
  auVar51._4_4_ = fVar223 * (ray->dir).field_0.m128[1];
  auVar51._8_4_ = fVar223 * (ray->dir).field_0.m128[2];
  auVar51._12_4_ = fVar223 * (ray->dir).field_0.m128[3];
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 4 + 6)));
  auVar130._0_4_ = fVar223 * auVar41._0_4_;
  auVar130._4_4_ = fVar223 * auVar41._4_4_;
  auVar130._8_4_ = fVar223 * auVar41._8_4_;
  auVar130._12_4_ = fVar223 * auVar41._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 5 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 6 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0xf + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar25 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1a + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1b + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1c + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar140._4_4_ = auVar51._0_4_;
  auVar140._0_4_ = auVar51._0_4_;
  auVar140._8_4_ = auVar51._0_4_;
  auVar140._12_4_ = auVar51._0_4_;
  auVar56 = vshufps_avx(auVar51,auVar51,0x55);
  auVar57 = vshufps_avx(auVar51,auVar51,0xaa);
  fVar223 = auVar57._0_4_;
  auVar52._0_4_ = fVar223 * auVar37._0_4_;
  fVar206 = auVar57._4_4_;
  auVar52._4_4_ = fVar206 * auVar37._4_4_;
  fVar218 = auVar57._8_4_;
  auVar52._8_4_ = fVar218 * auVar37._8_4_;
  fVar219 = auVar57._12_4_;
  auVar52._12_4_ = fVar219 * auVar37._12_4_;
  auVar48._0_4_ = auVar38._0_4_ * fVar223;
  auVar48._4_4_ = auVar38._4_4_ * fVar206;
  auVar48._8_4_ = auVar38._8_4_ * fVar218;
  auVar48._12_4_ = auVar38._12_4_ * fVar219;
  auVar43._0_4_ = auVar39._0_4_ * fVar223;
  auVar43._4_4_ = auVar39._4_4_ * fVar206;
  auVar43._8_4_ = auVar39._8_4_ * fVar218;
  auVar43._12_4_ = auVar39._12_4_ * fVar219;
  auVar57 = vfmadd231ps_fma(auVar52,auVar56,auVar41);
  auVar58 = vfmadd231ps_fma(auVar48,auVar56,auVar55);
  auVar56 = vfmadd231ps_fma(auVar43,auVar54,auVar56);
  auVar57 = vfmadd231ps_fma(auVar57,auVar140,auVar40);
  auVar58 = vfmadd231ps_fma(auVar58,auVar140,auVar50);
  auVar60 = vfmadd231ps_fma(auVar56,auVar53,auVar140);
  auVar245._4_4_ = auVar130._0_4_;
  auVar245._0_4_ = auVar130._0_4_;
  auVar245._8_4_ = auVar130._0_4_;
  auVar245._12_4_ = auVar130._0_4_;
  auVar56 = vshufps_avx(auVar130,auVar130,0x55);
  auVar79._16_16_ = in_YmmResult._16_16_;
  auVar36 = vshufps_avx512vl(auVar130,auVar130,0xaa);
  auVar37 = vmulps_avx512vl(auVar36,auVar37);
  auVar38 = vmulps_avx512vl(auVar36,auVar38);
  auVar39 = vmulps_avx512vl(auVar36,auVar39);
  auVar41 = vfmadd231ps_fma(auVar37,auVar56,auVar41);
  auVar37 = vfmadd231ps_fma(auVar38,auVar56,auVar55);
  auVar55 = vfmadd231ps_fma(auVar39,auVar56,auVar54);
  auVar42 = vfmadd231ps_fma(auVar41,auVar245,auVar40);
  auVar43 = vfmadd231ps_fma(auVar37,auVar245,auVar50);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar259 = ZEXT1664(auVar40);
  auVar44 = vfmadd231ps_fma(auVar55,auVar245,auVar53);
  auVar41 = vandps_avx512vl(auVar57,auVar40);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar41,auVar168,1);
  bVar34 = (bool)((byte)uVar35 & 1);
  auVar45._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._0_4_;
  bVar34 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._4_4_;
  bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._8_4_;
  bVar34 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._12_4_;
  auVar41 = vandps_avx512vl(auVar58,auVar40);
  uVar35 = vcmpps_avx512vl(auVar41,auVar168,1);
  bVar34 = (bool)((byte)uVar35 & 1);
  auVar46._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._0_4_;
  bVar34 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._4_4_;
  bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._8_4_;
  bVar34 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._12_4_;
  auVar40 = vandps_avx512vl(auVar60,auVar40);
  uVar35 = vcmpps_avx512vl(auVar40,auVar168,1);
  bVar34 = (bool)((byte)uVar35 & 1);
  auVar47._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar60._0_4_;
  bVar34 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar60._4_4_;
  bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar60._8_4_;
  bVar34 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar60._12_4_;
  auVar41 = vrcp14ps_avx512vl(auVar45);
  auVar169._8_4_ = 0x3f800000;
  auVar169._0_8_ = &DAT_3f8000003f800000;
  auVar169._12_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar45,auVar41,auVar169);
  auVar60 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  auVar41 = vrcp14ps_avx512vl(auVar46);
  auVar40 = vfnmadd213ps_fma(auVar46,auVar41,auVar169);
  auVar36 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  auVar41 = vrcp14ps_avx512vl(auVar47);
  auVar40 = vfnmadd213ps_fma(auVar47,auVar41,auVar169);
  auVar59 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  fVar223 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar32 + 0x16)) *
            *(float *)(prim + lVar32 + 0x1a);
  auVar153._4_4_ = fVar223;
  auVar153._0_4_ = fVar223;
  auVar153._8_4_ = fVar223;
  auVar153._12_4_ = fVar223;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar25 * 7 + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar25 * 0xb + 6);
  auVar41 = vpmovsxwd_avx(auVar41);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar50 = vsubps_avx(auVar41,auVar40);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar25 * 9 + 6);
  auVar41 = vpmovsxwd_avx(auVar37);
  auVar37 = vfmadd213ps_fma(auVar50,auVar153,auVar40);
  auVar40 = vcvtdq2ps_avx(auVar41);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar25 * 0xd + 6);
  auVar41 = vpmovsxwd_avx(auVar50);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar50 = vfmadd213ps_fma(auVar41,auVar153,auVar40);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar25 * 0x12 + 6);
  auVar40 = vpmovsxwd_avx(auVar55);
  auVar40 = vcvtdq2ps_avx(auVar40);
  uVar35 = (ulong)(uint)((int)(uVar25 * 5) << 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar25 * 2 + uVar35 + 6);
  auVar41 = vpmovsxwd_avx(auVar38);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar55 = vfmadd213ps_fma(auVar41,auVar153,auVar40);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar40 = vpmovsxwd_avx(auVar53);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar25 * 0x18 + 6);
  auVar41 = vpmovsxwd_avx(auVar54);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar38 = vfmadd213ps_fma(auVar41,auVar153,auVar40);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar25 * 0x1d + 6);
  auVar40 = vpmovsxwd_avx(auVar39);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar25 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar41 = vpmovsxwd_avx(auVar56);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar53 = vfmadd213ps_fma(auVar41,auVar153,auVar40);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar25) + 6);
  auVar40 = vpmovsxwd_avx(auVar57);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar25 * 0x23 + 6);
  auVar41 = vpmovsxwd_avx(auVar58);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar41 = vsubps_avx(auVar41,auVar40);
  auVar41 = vfmadd213ps_fma(auVar41,auVar153,auVar40);
  auVar40 = vsubps_avx(auVar37,auVar42);
  auVar154._0_4_ = auVar60._0_4_ * auVar40._0_4_;
  auVar154._4_4_ = auVar60._4_4_ * auVar40._4_4_;
  auVar154._8_4_ = auVar60._8_4_ * auVar40._8_4_;
  auVar154._12_4_ = auVar60._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar50,auVar42);
  auVar109._0_4_ = auVar60._0_4_ * auVar40._0_4_;
  auVar109._4_4_ = auVar60._4_4_ * auVar40._4_4_;
  auVar109._8_4_ = auVar60._8_4_ * auVar40._8_4_;
  auVar109._12_4_ = auVar60._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar55,auVar43);
  auVar141._0_4_ = auVar36._0_4_ * auVar40._0_4_;
  auVar141._4_4_ = auVar36._4_4_ * auVar40._4_4_;
  auVar141._8_4_ = auVar36._8_4_ * auVar40._8_4_;
  auVar141._12_4_ = auVar36._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar38,auVar43);
  auVar49._0_4_ = auVar36._0_4_ * auVar40._0_4_;
  auVar49._4_4_ = auVar36._4_4_ * auVar40._4_4_;
  auVar49._8_4_ = auVar36._8_4_ * auVar40._8_4_;
  auVar49._12_4_ = auVar36._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar53,auVar44);
  auVar131._0_4_ = auVar59._0_4_ * auVar40._0_4_;
  auVar131._4_4_ = auVar59._4_4_ * auVar40._4_4_;
  auVar131._8_4_ = auVar59._8_4_ * auVar40._8_4_;
  auVar131._12_4_ = auVar59._12_4_ * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar41,auVar44);
  auVar44._0_4_ = auVar59._0_4_ * auVar40._0_4_;
  auVar44._4_4_ = auVar59._4_4_ * auVar40._4_4_;
  auVar44._8_4_ = auVar59._8_4_ * auVar40._8_4_;
  auVar44._12_4_ = auVar59._12_4_ * auVar40._12_4_;
  auVar40 = vpminsd_avx(auVar154,auVar109);
  auVar41 = vpminsd_avx(auVar141,auVar49);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar41 = vpminsd_avx(auVar131,auVar44);
  uVar94 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar60._4_4_ = uVar94;
  auVar60._0_4_ = uVar94;
  auVar60._8_4_ = uVar94;
  auVar60._12_4_ = uVar94;
  auVar41 = vmaxps_avx512vl(auVar41,auVar60);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar36._8_4_ = 0x3f7ffffa;
  auVar36._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar36._12_4_ = 0x3f7ffffa;
  local_d8 = vmulps_avx512vl(auVar40,auVar36);
  auVar40 = vpmaxsd_avx(auVar154,auVar109);
  auVar41 = vpmaxsd_avx(auVar141,auVar49);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar41 = vpmaxsd_avx(auVar131,auVar44);
  fVar223 = ray->tfar;
  auVar59._4_4_ = fVar223;
  auVar59._0_4_ = fVar223;
  auVar59._8_4_ = fVar223;
  auVar59._12_4_ = fVar223;
  auVar41 = vminps_avx512vl(auVar41,auVar59);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar42._8_4_ = 0x3f800003;
  auVar42._0_8_ = 0x3f8000033f800003;
  auVar42._12_4_ = 0x3f800003;
  auVar40 = vmulps_avx512vl(auVar40,auVar42);
  auVar41 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_d8,auVar40,2);
  uVar35 = vpcmpgtd_avx512vl(auVar41,_DAT_01ff0cf0);
  uVar35 = ((byte)uVar14 & 0xf) & uVar35;
  bVar34 = (char)uVar35 == '\0';
  local_379 = !bVar34;
  if (bVar34) {
    return local_379;
  }
  auVar40 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar263 = ZEXT1664(auVar40);
  local_2b0 = prim;
LAB_01c573df:
  lVar32 = 0;
  for (uVar25 = uVar35; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar33 = *(uint *)(local_2b0 + 2);
  pGVar7 = (context->scene->geometries).items[uVar33].ptr;
  fVar223 = (pGVar7->time_range).lower;
  fVar218 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar223) / ((pGVar7->time_range).upper - fVar223));
  auVar40 = vroundss_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),9);
  local_2b8 = (ulong)*(uint *)(local_2b0 + lVar32 * 4 + 6);
  auVar41 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar40 = vminss_avx(auVar40,auVar41);
  auVar42 = vmaxss_avx512f(auVar263._0_16_,auVar40);
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_2b8 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = (long)(int)auVar42._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar29);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar29);
  auVar40 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar25);
  lVar32 = uVar25 + 1;
  auVar41 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar32);
  lVar30 = uVar25 + 2;
  auVar37 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar30);
  lVar1 = uVar25 + 3;
  auVar50 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar29);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar29);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar25);
  auVar38 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar30);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar29);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar29);
  auVar39 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar25);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar30);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar29);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar29);
  auVar60 = *(undefined1 (*) [16])(lVar10 + uVar25 * lVar9);
  auVar36 = *(undefined1 (*) [16])(lVar10 + lVar32 * lVar9);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar30 * lVar9);
  fVar218 = fVar218 - auVar42._0_4_;
  auVar75._0_16_ = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar42 = vmulps_avx512vl(auVar50,auVar75._0_16_);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar44 = vfmadd213ps_avx512vl(auVar43,auVar37,auVar42);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar41,auVar45);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar43);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar37,auVar46);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar41,auVar75._0_16_);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar40,auVar46);
  auVar47 = vmulps_avx512vl(auVar54,auVar75._0_16_);
  auVar48 = vfmadd213ps_avx512vl(auVar43,auVar53,auVar47);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar38,auVar45);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar43);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar53,auVar46);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar38,auVar75._0_16_);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar55,auVar46);
  auVar49 = vmulps_avx512vl(auVar50,auVar43);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar37,auVar45);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar41,auVar43);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar40,auVar75._0_16_);
  auVar50 = vmulps_avx512vl(auVar50,auVar46);
  auVar37 = vfmadd231ps_avx512vl(auVar50,auVar75._0_16_,auVar37);
  auVar41 = vfnmadd231ps_avx512vl(auVar37,auVar46,auVar41);
  auVar51 = vfnmadd231ps_avx512vl(auVar41,auVar75._0_16_,auVar40);
  auVar40 = vmulps_avx512vl(auVar54,auVar43);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar53,auVar45);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar43);
  auVar52 = vfmadd231ps_avx512vl(auVar40,auVar55,auVar75._0_16_);
  auVar40 = vmulps_avx512vl(auVar54,auVar46);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar75._0_16_,auVar53);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar46,auVar38);
  auVar38 = vfnmadd231ps_avx512vl(auVar40,auVar75._0_16_,auVar55);
  auVar41 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar40 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar40 = vmulps_avx512vl(auVar42,auVar40);
  auVar40 = vfmsub231ps_avx512vl(auVar40,auVar41,auVar48);
  auVar37 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar40 = vmulps_avx512vl(auVar42,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar47);
  auVar50 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar41 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar155._0_4_ = auVar51._0_4_ * auVar41._0_4_;
  auVar155._4_4_ = auVar51._4_4_ * auVar41._4_4_;
  auVar155._8_4_ = auVar51._8_4_ * auVar41._8_4_;
  auVar155._12_4_ = auVar51._12_4_ * auVar41._12_4_;
  auVar41 = vfmsub231ps_fma(auVar155,auVar40,auVar52);
  auVar55 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar156._0_4_ = auVar51._0_4_ * auVar41._0_4_;
  auVar156._4_4_ = auVar51._4_4_ * auVar41._4_4_;
  auVar156._8_4_ = auVar51._8_4_ * auVar41._8_4_;
  auVar156._12_4_ = auVar51._12_4_ * auVar41._12_4_;
  auVar40 = vfmsub231ps_fma(auVar156,auVar40,auVar38);
  auVar38 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar37,auVar37,0x7f);
  auVar75._16_16_ = auVar79._16_16_;
  auVar61._4_28_ = auVar75._4_28_;
  auVar61._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar75._0_16_,auVar61._0_16_);
  auVar53 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  auVar54 = vmulss_avx512f(auVar54,auVar41);
  auVar41 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_)));
  fVar223 = auVar53._0_4_ + auVar41._0_4_;
  auVar185._4_4_ = fVar223;
  auVar185._0_4_ = fVar223;
  auVar185._8_4_ = fVar223;
  auVar185._12_4_ = fVar223;
  auVar41 = vdpps_avx(auVar37,auVar50,0x7f);
  auVar53 = vmulps_avx512vl(auVar37,auVar185);
  auVar54 = vbroadcastss_avx512vl(auVar40);
  auVar50 = vmulps_avx512vl(auVar54,auVar50);
  fVar206 = auVar41._0_4_;
  auVar142._0_4_ = fVar206 * auVar37._0_4_;
  auVar142._4_4_ = fVar206 * auVar37._4_4_;
  auVar142._8_4_ = fVar206 * auVar37._8_4_;
  auVar142._12_4_ = fVar206 * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar50,auVar142);
  auVar41 = vrcp14ss_avx512f(auVar75._0_16_,auVar61._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
  fVar219 = auVar41._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar77._16_16_ = auVar79._16_16_;
  auVar77._0_16_ = auVar75._0_16_;
  auVar78._4_28_ = auVar77._4_28_;
  auVar78._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar75._0_16_,auVar78._0_16_);
  auVar50 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar206 = auVar41._0_4_;
  fVar206 = auVar50._0_4_ + auVar54._0_4_ * fVar206 * fVar206 * fVar206;
  auVar186._0_4_ = auVar55._0_4_ * fVar206;
  auVar186._4_4_ = auVar55._4_4_ * fVar206;
  auVar186._8_4_ = auVar55._8_4_ * fVar206;
  auVar186._12_4_ = auVar55._12_4_ * fVar206;
  auVar41 = vdpps_avx(auVar55,auVar38,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar40);
  auVar50 = vmulps_avx512vl(auVar50,auVar38);
  fVar220 = auVar41._0_4_;
  auVar99._0_4_ = fVar220 * auVar55._0_4_;
  auVar99._4_4_ = fVar220 * auVar55._4_4_;
  auVar99._8_4_ = fVar220 * auVar55._8_4_;
  auVar99._12_4_ = fVar220 * auVar55._12_4_;
  auVar41 = vsubps_avx(auVar50,auVar99);
  auVar50 = vrcp14ss_avx512f(auVar75._0_16_,auVar78._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar50,ZEXT416(0x40000000));
  fVar220 = auVar50._0_4_ * auVar40._0_4_;
  auVar40 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar50 = vmulps_avx512vl(auVar40,auVar53);
  auVar47 = vsubps_avx512vl(auVar44,auVar50);
  auVar55 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar53);
  auVar132._0_4_ = auVar55._0_4_ + auVar40._0_4_ * fVar223 * fVar219 * auVar37._0_4_;
  auVar132._4_4_ = auVar55._4_4_ + auVar40._4_4_ * fVar223 * fVar219 * auVar37._4_4_;
  auVar132._8_4_ = auVar55._8_4_ + auVar40._8_4_ * fVar223 * fVar219 * auVar37._8_4_;
  auVar132._12_4_ = auVar55._12_4_ + auVar40._12_4_ * fVar223 * fVar219 * auVar37._12_4_;
  auVar37 = vsubps_avx512vl(auVar42,auVar132);
  auVar44 = vaddps_avx512vl(auVar44,auVar50);
  auVar50 = vaddps_avx512vl(auVar42,auVar132);
  auVar40 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar55 = vmulps_avx512vl(auVar40,auVar186);
  auVar42 = vsubps_avx512vl(auVar49,auVar55);
  auVar38 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar38 = vmulps_avx512vl(auVar38,auVar186);
  auVar187._0_4_ = auVar38._0_4_ + auVar40._0_4_ * fVar206 * auVar41._0_4_ * fVar220;
  auVar187._4_4_ = auVar38._4_4_ + auVar40._4_4_ * fVar206 * auVar41._4_4_ * fVar220;
  auVar187._8_4_ = auVar38._8_4_ + auVar40._8_4_ * fVar206 * auVar41._8_4_ * fVar220;
  auVar187._12_4_ = auVar38._12_4_ + auVar40._12_4_ * fVar206 * auVar41._12_4_ * fVar220;
  auVar40 = vsubps_avx(auVar51,auVar187);
  auVar48 = vaddps_avx512vl(auVar49,auVar55);
  auVar41 = vaddps_avx512vl(auVar51,auVar187);
  auVar95._8_4_ = 0x3eaaaaab;
  auVar95._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar95._12_4_ = 0x3eaaaaab;
  auVar170._0_4_ = auVar47._0_4_ + auVar37._0_4_ * 0.33333334;
  auVar170._4_4_ = auVar47._4_4_ + auVar37._4_4_ * 0.33333334;
  auVar170._8_4_ = auVar47._8_4_ + auVar37._8_4_ * 0.33333334;
  auVar170._12_4_ = auVar47._12_4_ + auVar37._12_4_ * 0.33333334;
  auVar157._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar157._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar157._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar157._12_4_ = auVar40._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar42,auVar157);
  local_378._4_4_ = auVar44._4_4_ + auVar50._4_4_ * 0.33333334;
  local_378._0_4_ = auVar44._0_4_ + auVar50._0_4_ * 0.33333334;
  fStack_370 = auVar44._8_4_ + auVar50._8_4_ * 0.33333334;
  fStack_36c = auVar44._12_4_ + auVar50._12_4_ * 0.33333334;
  auVar40 = vmulps_avx512vl(auVar41,auVar95);
  auVar54 = vsubps_avx(auVar48,auVar40);
  auVar40 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar1);
  auVar41 = vmulps_avx512vl(auVar58,auVar75._0_16_);
  auVar37 = vfmadd213ps_avx512vl(auVar43,auVar57,auVar41);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar56,auVar45);
  auVar49 = vfmadd231ps_avx512vl(auVar37,auVar39,auVar43);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar57,auVar46);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar56,auVar75._0_16_);
  auVar51 = vfnmadd231ps_avx512vl(auVar41,auVar39,auVar46);
  auVar41 = vmulps_avx512vl(auVar40,auVar75._0_16_);
  auVar37 = vfmadd213ps_avx512vl(auVar43,auVar59,auVar41);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar36,auVar45);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar60,auVar43);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar59,auVar46);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar36,auVar75._0_16_);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar60,auVar46);
  auVar50 = vmulps_avx512vl(auVar58,auVar43);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar57,auVar45);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar56,auVar43);
  auVar52 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar75._0_16_);
  auVar50 = vmulps_avx512vl(auVar58,auVar46);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar75._0_16_,auVar57);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar46,auVar56);
  auVar39 = vfnmadd231ps_avx512vl(auVar50,auVar75._0_16_,auVar39);
  auVar50 = vmulps_avx512vl(auVar40,auVar43);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar59,auVar45);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar36,auVar43);
  auVar55 = vfmadd231ps_avx512vl(auVar50,auVar60,auVar75._0_16_);
  auVar40 = vmulps_avx512vl(auVar40,auVar46);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar75._0_16_,auVar59);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar46,auVar36);
  auVar261 = ZEXT464(0x3f800000);
  auVar38 = vfnmadd231ps_avx512vl(auVar40,auVar75._0_16_,auVar60);
  auVar40 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar50 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  fVar219 = auVar51._0_4_;
  auVar238._0_4_ = fVar219 * auVar50._0_4_;
  fVar220 = auVar51._4_4_;
  auVar238._4_4_ = fVar220 * auVar50._4_4_;
  fVar221 = auVar51._8_4_;
  auVar238._8_4_ = fVar221 * auVar50._8_4_;
  fVar222 = auVar51._12_4_;
  auVar238._12_4_ = fVar222 * auVar50._12_4_;
  auVar37 = vfmsub231ps_avx512vl(auVar238,auVar40,auVar37);
  auVar37 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar50 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  auVar246._0_4_ = fVar219 * auVar50._0_4_;
  auVar246._4_4_ = fVar220 * auVar50._4_4_;
  auVar246._8_4_ = fVar221 * auVar50._8_4_;
  auVar246._12_4_ = fVar222 * auVar50._12_4_;
  auVar40 = vfmsub231ps_avx512vl(auVar246,auVar40,auVar41);
  auVar50 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar41 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  auVar40 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar40 = vmulps_avx512vl(auVar39,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar55);
  auVar55 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar40 = vmulps_avx512vl(auVar39,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar38);
  auVar38 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar37,auVar37,0x7f);
  auVar62._16_16_ = auVar79._16_16_;
  auVar62._0_16_ = auVar75._0_16_;
  auVar63._4_28_ = auVar62._4_28_;
  auVar63._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar75._0_16_,auVar63._0_16_);
  auVar56 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  auVar57 = vmulss_avx512f(auVar57,auVar41);
  auVar41 = vmulss_avx512f(auVar41,auVar41);
  auVar41 = vmulss_avx512f(auVar57,auVar41);
  auVar41 = vaddss_avx512f(auVar56,auVar41);
  auVar56 = vbroadcastss_avx512vl(auVar41);
  auVar57 = vmulps_avx512vl(auVar37,auVar56);
  auVar41 = vdpps_avx(auVar37,auVar50,0x7f);
  auVar58 = vbroadcastss_avx512vl(auVar40);
  auVar50 = vmulps_avx512vl(auVar58,auVar50);
  fVar223 = auVar41._0_4_;
  auVar143._0_4_ = auVar37._0_4_ * fVar223;
  auVar143._4_4_ = auVar37._4_4_ * fVar223;
  auVar143._8_4_ = auVar37._8_4_ * fVar223;
  auVar143._12_4_ = auVar37._12_4_ * fVar223;
  auVar41 = vsubps_avx(auVar50,auVar143);
  auVar37 = vrcp14ss_avx512f(auVar75._0_16_,auVar63._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar37,ZEXT416(0x40000000));
  fVar223 = auVar37._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar144._0_4_ = fVar223 * auVar41._0_4_;
  auVar144._4_4_ = fVar223 * auVar41._4_4_;
  auVar144._8_4_ = fVar223 * auVar41._8_4_;
  auVar144._12_4_ = fVar223 * auVar41._12_4_;
  auVar37 = vmulps_avx512vl(auVar56,auVar144);
  auVar65._16_16_ = auVar79._16_16_;
  auVar65._0_16_ = auVar75._0_16_;
  auVar64._4_28_ = auVar65._4_28_;
  auVar64._0_4_ = auVar40._0_4_;
  auVar41 = vrsqrt14ss_avx512f(auVar75._0_16_,auVar64._0_16_);
  auVar50 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
  auVar56 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  auVar56 = vmulss_avx512f(auVar56,auVar41);
  auVar41 = vmulss_avx512f(auVar56,ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_)));
  fVar223 = auVar50._0_4_ + auVar41._0_4_;
  auVar253._0_4_ = auVar55._0_4_ * fVar223;
  auVar253._4_4_ = auVar55._4_4_ * fVar223;
  auVar253._8_4_ = auVar55._8_4_ * fVar223;
  auVar253._12_4_ = auVar55._12_4_ * fVar223;
  auVar41 = vdpps_avx(auVar55,auVar38,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar40);
  auVar50 = vmulps_avx512vl(auVar50,auVar38);
  fVar206 = auVar41._0_4_;
  auVar158._0_4_ = auVar55._0_4_ * fVar206;
  auVar158._4_4_ = auVar55._4_4_ * fVar206;
  auVar158._8_4_ = auVar55._8_4_ * fVar206;
  auVar158._12_4_ = auVar55._12_4_ * fVar206;
  auVar41 = vsubps_avx(auVar50,auVar158);
  auVar50 = vrcp14ss_avx512f(auVar75._0_16_,auVar64._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar50,ZEXT416(0x40000000));
  fVar206 = auVar50._0_4_ * auVar40._0_4_;
  auVar50 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar55 = vmulps_avx512vl(auVar50,auVar57);
  auVar38 = vsubps_avx512vl(auVar49,auVar55);
  auVar40 = vshufps_avx(auVar51,auVar51,0xff);
  auVar40 = vmulps_avx512vl(auVar40,auVar57);
  auVar145._0_4_ = auVar40._0_4_ + auVar50._0_4_ * auVar37._0_4_;
  auVar145._4_4_ = auVar40._4_4_ + auVar50._4_4_ * auVar37._4_4_;
  auVar145._8_4_ = auVar40._8_4_ + auVar50._8_4_ * auVar37._8_4_;
  auVar145._12_4_ = auVar40._12_4_ + auVar50._12_4_ * auVar37._12_4_;
  auVar40 = vsubps_avx(auVar51,auVar145);
  auVar37 = vaddps_avx512vl(auVar49,auVar55);
  auVar50 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar239._0_4_ = auVar50._0_4_ * auVar253._0_4_;
  auVar239._4_4_ = auVar50._4_4_ * auVar253._4_4_;
  auVar239._8_4_ = auVar50._8_4_ * auVar253._8_4_;
  auVar239._12_4_ = auVar50._12_4_ * auVar253._12_4_;
  auVar55 = vsubps_avx512vl(auVar52,auVar239);
  auVar56 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar56 = vmulps_avx512vl(auVar56,auVar253);
  auVar159._0_4_ = auVar56._0_4_ + auVar50._0_4_ * fVar223 * fVar206 * auVar41._0_4_;
  auVar159._4_4_ = auVar56._4_4_ + auVar50._4_4_ * fVar223 * fVar206 * auVar41._4_4_;
  auVar159._8_4_ = auVar56._8_4_ + auVar50._8_4_ * fVar223 * fVar206 * auVar41._8_4_;
  auVar159._12_4_ = auVar56._12_4_ + auVar50._12_4_ * fVar223 * fVar206 * auVar41._12_4_;
  auVar41 = vsubps_avx512vl(auVar39,auVar159);
  auVar50 = vaddps_avx512vl(auVar52,auVar239);
  auVar39 = vaddps_avx512vl(auVar39,auVar159);
  auVar207._0_4_ = auVar38._0_4_ + auVar40._0_4_ * 0.33333334;
  auVar207._4_4_ = auVar38._4_4_ + auVar40._4_4_ * 0.33333334;
  auVar207._8_4_ = auVar38._8_4_ + auVar40._8_4_ * 0.33333334;
  auVar207._12_4_ = auVar38._12_4_ + auVar40._12_4_ * 0.33333334;
  auVar198._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar40 = vsubps_avx(auVar55,auVar198);
  auVar146._0_4_ = auVar37._0_4_ + (fVar219 + auVar145._0_4_) * 0.33333334;
  auVar146._4_4_ = auVar37._4_4_ + (fVar220 + auVar145._4_4_) * 0.33333334;
  auVar146._8_4_ = auVar37._8_4_ + (fVar221 + auVar145._8_4_) * 0.33333334;
  auVar146._12_4_ = auVar37._12_4_ + (fVar222 + auVar145._12_4_) * 0.33333334;
  auVar160._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar160._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar160._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar160._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar41 = vsubps_avx(auVar50,auVar160);
  auVar254._4_4_ = fVar218;
  auVar254._0_4_ = fVar218;
  auVar254._8_4_ = fVar218;
  auVar254._12_4_ = fVar218;
  auVar39 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar218));
  auVar96._0_4_ = auVar39._0_4_;
  auVar96._4_4_ = auVar96._0_4_;
  auVar96._8_4_ = auVar96._0_4_;
  auVar96._12_4_ = auVar96._0_4_;
  auVar38 = vmulps_avx512vl(auVar254,auVar38);
  auVar39 = vmulps_avx512vl(auVar254,auVar207);
  auVar40 = vmulps_avx512vl(auVar254,auVar40);
  auVar247._0_4_ = fVar218 * auVar55._0_4_;
  auVar247._4_4_ = fVar218 * auVar55._4_4_;
  auVar247._8_4_ = fVar218 * auVar55._8_4_;
  auVar247._12_4_ = fVar218 * auVar55._12_4_;
  local_208 = vfmadd231ps_avx512vl(auVar38,auVar96,auVar47);
  local_218 = vfmadd231ps_avx512vl(auVar39,auVar96,auVar170);
  local_228 = vfmadd231ps_avx512vl(auVar40,auVar96,auVar53);
  local_238 = vfmadd231ps_fma(auVar247,auVar96,auVar42);
  auVar40 = vmulps_avx512vl(auVar254,auVar37);
  auVar37 = vmulps_avx512vl(auVar254,auVar146);
  auVar41 = vmulps_avx512vl(auVar254,auVar41);
  auVar240._0_4_ = fVar218 * auVar50._0_4_;
  auVar240._4_4_ = fVar218 * auVar50._4_4_;
  auVar240._8_4_ = fVar218 * auVar50._8_4_;
  auVar240._12_4_ = fVar218 * auVar50._12_4_;
  _local_248 = vfmadd231ps_avx512vl(auVar40,auVar96,auVar44);
  _local_258 = vfmadd231ps_avx512vl(auVar37,auVar96,_local_378);
  _local_268 = vfmadd231ps_avx512vl(auVar41,auVar96,auVar54);
  _local_278 = vfmadd231ps_fma(auVar240,auVar96,auVar48);
  aVar2 = (ray->org).field_0;
  auVar41 = vsubps_avx512vl(local_208,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar100._4_4_ = uVar94;
  auVar100._0_4_ = uVar94;
  auVar100._8_4_ = uVar94;
  auVar100._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  fVar223 = (pre->ray_space).vz.field_0.m128[0];
  fVar206 = (pre->ray_space).vz.field_0.m128[1];
  fVar218 = (pre->ray_space).vz.field_0.m128[2];
  fVar219 = (pre->ray_space).vz.field_0.m128[3];
  auVar97._0_4_ = fVar223 * auVar41._0_4_;
  auVar97._4_4_ = fVar206 * auVar41._4_4_;
  auVar97._8_4_ = fVar218 * auVar41._8_4_;
  auVar97._12_4_ = fVar219 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar4,auVar40);
  auVar38 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar100);
  auVar41 = vsubps_avx512vl(local_218,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar110._4_4_ = uVar94;
  auVar110._0_4_ = uVar94;
  auVar110._8_4_ = uVar94;
  auVar110._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar101._0_4_ = fVar223 * auVar41._0_4_;
  auVar101._4_4_ = fVar206 * auVar41._4_4_;
  auVar101._8_4_ = fVar218 * auVar41._8_4_;
  auVar101._12_4_ = fVar219 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar4,auVar40);
  auVar53 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar110);
  auVar41 = vsubps_avx512vl(local_228,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar161._4_4_ = uVar94;
  auVar161._0_4_ = uVar94;
  auVar161._8_4_ = uVar94;
  auVar161._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar111._0_4_ = fVar223 * auVar41._0_4_;
  auVar111._4_4_ = fVar206 * auVar41._4_4_;
  auVar111._8_4_ = fVar218 * auVar41._8_4_;
  auVar111._12_4_ = fVar219 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar4,auVar40);
  auVar54 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar161);
  auVar41 = vsubps_avx(local_238,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar188._4_4_ = uVar94;
  auVar188._0_4_ = uVar94;
  auVar188._8_4_ = uVar94;
  auVar188._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar162._0_4_ = fVar223 * auVar41._0_4_;
  auVar162._4_4_ = fVar206 * auVar41._4_4_;
  auVar162._8_4_ = fVar218 * auVar41._8_4_;
  auVar162._12_4_ = fVar219 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar4,auVar40);
  auVar39 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar188);
  auVar41 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar199._4_4_ = uVar94;
  auVar199._0_4_ = uVar94;
  auVar199._8_4_ = uVar94;
  auVar199._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar189._0_4_ = auVar41._0_4_ * fVar223;
  auVar189._4_4_ = auVar41._4_4_ * fVar206;
  auVar189._8_4_ = auVar41._8_4_ * fVar218;
  auVar189._12_4_ = auVar41._12_4_ * fVar219;
  auVar40 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar4,auVar40);
  auVar56 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar199);
  auVar41 = vsubps_avx512vl(_local_258,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar208._4_4_ = uVar94;
  auVar208._0_4_ = uVar94;
  auVar208._8_4_ = uVar94;
  auVar208._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar200._0_4_ = auVar41._0_4_ * fVar223;
  auVar200._4_4_ = auVar41._4_4_ * fVar206;
  auVar200._8_4_ = auVar41._8_4_ * fVar218;
  auVar200._12_4_ = auVar41._12_4_ * fVar219;
  auVar40 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar4,auVar40);
  auVar57 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar208);
  auVar41 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar224._4_4_ = uVar94;
  auVar224._0_4_ = uVar94;
  auVar224._8_4_ = uVar94;
  auVar224._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar209._0_4_ = auVar41._0_4_ * fVar223;
  auVar209._4_4_ = auVar41._4_4_ * fVar206;
  auVar209._8_4_ = auVar41._8_4_ * fVar218;
  auVar209._12_4_ = auVar41._12_4_ * fVar219;
  auVar40 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar4,auVar40);
  auVar58 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar224);
  auVar41 = vsubps_avx(_local_278,(undefined1  [16])aVar2);
  uVar94 = auVar41._0_4_;
  auVar225._4_4_ = uVar94;
  auVar225._0_4_ = uVar94;
  auVar225._8_4_ = uVar94;
  auVar225._12_4_ = uVar94;
  auVar40 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar133._0_4_ = fVar223 * auVar41._0_4_;
  auVar133._4_4_ = fVar206 * auVar41._4_4_;
  auVar133._8_4_ = fVar218 * auVar41._8_4_;
  auVar133._12_4_ = fVar219 * auVar41._12_4_;
  auVar40 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar4,auVar40);
  auVar60 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar225);
  auVar37 = vmovlhps_avx(auVar38,auVar56);
  local_318 = vmovlhps_avx(auVar53,auVar57);
  local_308 = vmovlhps_avx512f(auVar54,auVar58);
  _local_1e8 = vmovlhps_avx512f(auVar39,auVar60);
  auVar41 = vminps_avx(auVar37,local_318);
  auVar40 = vmaxps_avx(auVar37,local_318);
  auVar50 = vminps_avx512vl(local_308,_local_1e8);
  auVar41 = vminps_avx(auVar41,auVar50);
  auVar50 = vmaxps_avx512vl(local_308,_local_1e8);
  auVar40 = vmaxps_avx(auVar40,auVar50);
  auVar50 = vshufpd_avx(auVar41,auVar41,3);
  auVar55 = vshufpd_avx(auVar40,auVar40,3);
  auVar41 = vminps_avx(auVar41,auVar50);
  auVar40 = vmaxps_avx(auVar40,auVar55);
  auVar41 = vandps_avx512vl(auVar41,auVar259._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar259._0_16_);
  auVar40 = vmaxps_avx(auVar41,auVar40);
  auVar41 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar41,auVar40);
  lVar32 = uVar35 + 0xf;
  local_168._8_8_ = auVar38._0_8_;
  local_168._0_8_ = auVar38._0_8_;
  local_178._8_8_ = auVar53._0_8_;
  local_178._0_8_ = auVar53._0_8_;
  local_188 = vmovddup_avx512vl(auVar54);
  local_198._0_8_ = auVar39._0_8_;
  local_198._8_8_ = local_198._0_8_;
  register0x00001348 = auVar56._0_8_;
  local_1a8 = auVar56._0_8_;
  register0x00001408 = auVar57._0_8_;
  local_1b8 = auVar57._0_8_;
  register0x00001448 = auVar58._0_8_;
  local_1c8 = auVar58._0_8_;
  register0x00001488 = auVar60._0_8_;
  local_1d8 = auVar60._0_8_;
  local_1f8 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_1f8);
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar40 = vxorps_avx512vl(local_78._0_16_,auVar17);
  local_98 = vbroadcastss_avx512vl(auVar40);
  local_2e8 = vsubps_avx(local_318,auVar37);
  local_2f8 = vsubps_avx512vl(local_308,local_318);
  local_c8 = vsubps_avx512vl(_local_1e8,local_308);
  local_e8 = vsubps_avx512vl(_local_248,local_208);
  local_f8 = vsubps_avx512vl(_local_258,local_218);
  local_108 = vsubps_avx512vl(_local_268,local_228);
  _local_118 = vsubps_avx(_local_278,local_238);
  bVar34 = false;
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar256 = ZEXT1664(auVar40);
  uVar25 = 0;
  do {
    auVar56 = auVar256._0_16_;
    auVar41 = vshufps_avx(auVar56,auVar56,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = &DAT_3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar244._16_4_ = 0x3f800000;
    auVar244._0_16_ = auVar241;
    auVar244._20_4_ = 0x3f800000;
    auVar244._24_4_ = 0x3f800000;
    auVar244._28_4_ = 0x3f800000;
    auVar50 = vsubps_avx(auVar241,auVar41);
    fVar223 = auVar41._0_4_;
    auVar121._0_4_ = local_1a8._0_4_ * fVar223;
    fVar206 = auVar41._4_4_;
    auVar121._4_4_ = local_1a8._4_4_ * fVar206;
    fVar218 = auVar41._8_4_;
    auVar121._8_4_ = local_1a8._8_4_ * fVar218;
    fVar219 = auVar41._12_4_;
    auVar121._12_4_ = local_1a8._12_4_ * fVar219;
    auVar134._0_4_ = local_1b8._0_4_ * fVar223;
    auVar134._4_4_ = local_1b8._4_4_ * fVar206;
    auVar134._8_4_ = local_1b8._8_4_ * fVar218;
    auVar134._12_4_ = local_1b8._12_4_ * fVar219;
    auVar147._0_4_ = local_1c8._0_4_ * fVar223;
    auVar147._4_4_ = local_1c8._4_4_ * fVar206;
    auVar147._8_4_ = local_1c8._8_4_ * fVar218;
    auVar147._12_4_ = local_1c8._12_4_ * fVar219;
    auVar102._0_4_ = local_1d8._0_4_ * fVar223;
    auVar102._4_4_ = local_1d8._4_4_ * fVar206;
    auVar102._8_4_ = local_1d8._8_4_ * fVar218;
    auVar102._12_4_ = local_1d8._12_4_ * fVar219;
    auVar55 = vfmadd231ps_fma(auVar121,auVar50,local_168);
    auVar38 = vfmadd231ps_fma(auVar134,auVar50,local_178);
    auVar53 = vfmadd231ps_avx512vl(auVar147,auVar50,local_188);
    auVar50 = vfmadd231ps_fma(auVar102,local_198,auVar50);
    auVar41 = vmovshdup_avx(auVar40);
    fVar206 = auVar40._0_4_;
    fVar223 = (auVar41._0_4_ - fVar206) * 0.04761905;
    auVar127._4_4_ = fVar206;
    auVar127._0_4_ = fVar206;
    auVar127._8_4_ = fVar206;
    auVar127._12_4_ = fVar206;
    auVar127._16_4_ = fVar206;
    auVar127._20_4_ = fVar206;
    auVar127._24_4_ = fVar206;
    auVar127._28_4_ = fVar206;
    auVar71._0_8_ = auVar41._0_8_;
    auVar71._8_8_ = auVar71._0_8_;
    auVar71._16_8_ = auVar71._0_8_;
    auVar71._24_8_ = auVar71._0_8_;
    auVar79 = vsubps_avx(auVar71,auVar127);
    uVar94 = auVar55._0_4_;
    auVar81._4_4_ = uVar94;
    auVar81._0_4_ = uVar94;
    auVar81._8_4_ = uVar94;
    auVar81._12_4_ = uVar94;
    auVar81._16_4_ = uVar94;
    auVar81._20_4_ = uVar94;
    auVar81._24_4_ = uVar94;
    auVar81._28_4_ = uVar94;
    auVar73._8_4_ = 1;
    auVar73._0_8_ = 0x100000001;
    auVar73._12_4_ = 1;
    auVar73._16_4_ = 1;
    auVar73._20_4_ = 1;
    auVar73._24_4_ = 1;
    auVar73._28_4_ = 1;
    auVar77 = ZEXT1632(auVar55);
    auVar75 = vpermps_avx2(auVar73,auVar77);
    auVar61 = vbroadcastss_avx512vl(auVar38);
    auVar78 = ZEXT1632(auVar38);
    auVar62 = vpermps_avx512vl(auVar73,auVar78);
    auVar63 = vbroadcastss_avx512vl(auVar53);
    auVar76 = ZEXT1632(auVar53);
    auVar64 = vpermps_avx512vl(auVar73,auVar76);
    auVar65 = vbroadcastss_avx512vl(auVar50);
    auVar74 = ZEXT1632(auVar50);
    auVar66 = vpermps_avx512vl(auVar73,auVar74);
    auVar204._4_4_ = fVar223;
    auVar204._0_4_ = fVar223;
    auVar204._8_4_ = fVar223;
    auVar204._12_4_ = fVar223;
    auVar204._16_4_ = fVar223;
    auVar204._20_4_ = fVar223;
    auVar204._24_4_ = fVar223;
    auVar204._28_4_ = fVar223;
    auVar72._8_4_ = 2;
    auVar72._0_8_ = 0x200000002;
    auVar72._12_4_ = 2;
    auVar72._16_4_ = 2;
    auVar72._20_4_ = 2;
    auVar72._24_4_ = 2;
    auVar72._28_4_ = 2;
    auVar67 = vpermps_avx512vl(auVar72,auVar77);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar69 = vpermps_avx512vl(auVar68,auVar77);
    auVar77 = vpermps_avx2(auVar72,auVar78);
    auVar70 = vpermps_avx512vl(auVar68,auVar78);
    auVar78 = vpermps_avx2(auVar72,auVar76);
    auVar71 = vpermps_avx512vl(auVar68,auVar76);
    auVar72 = vpermps_avx512vl(auVar72,auVar74);
    auVar73 = vpermps_avx512vl(auVar68,auVar74);
    auVar41 = vfmadd132ps_fma(auVar79,auVar127,_DAT_02020f20);
    auVar79 = vsubps_avx(auVar244,ZEXT1632(auVar41));
    auVar68 = vmulps_avx512vl(auVar61,ZEXT1632(auVar41));
    auVar76 = ZEXT1632(auVar41);
    auVar74 = vmulps_avx512vl(auVar62,auVar76);
    auVar50 = vfmadd231ps_fma(auVar68,auVar79,auVar81);
    auVar55 = vfmadd231ps_fma(auVar74,auVar79,auVar75);
    auVar68 = vmulps_avx512vl(auVar63,auVar76);
    auVar74 = vmulps_avx512vl(auVar64,auVar76);
    auVar61 = vfmadd231ps_avx512vl(auVar68,auVar79,auVar61);
    auVar62 = vfmadd231ps_avx512vl(auVar74,auVar79,auVar62);
    auVar68 = vmulps_avx512vl(auVar65,auVar76);
    auVar81 = ZEXT1632(auVar41);
    auVar66 = vmulps_avx512vl(auVar66,auVar81);
    auVar63 = vfmadd231ps_avx512vl(auVar68,auVar79,auVar63);
    auVar64 = vfmadd231ps_avx512vl(auVar66,auVar79,auVar64);
    fVar218 = auVar41._0_4_;
    fVar219 = auVar41._4_4_;
    auVar66._4_4_ = fVar219 * auVar61._4_4_;
    auVar66._0_4_ = fVar218 * auVar61._0_4_;
    fVar220 = auVar41._8_4_;
    auVar66._8_4_ = fVar220 * auVar61._8_4_;
    fVar221 = auVar41._12_4_;
    auVar66._12_4_ = fVar221 * auVar61._12_4_;
    auVar66._16_4_ = auVar61._16_4_ * 0.0;
    auVar66._20_4_ = auVar61._20_4_ * 0.0;
    auVar66._24_4_ = auVar61._24_4_ * 0.0;
    auVar66._28_4_ = fVar206;
    auVar68._4_4_ = fVar219 * auVar62._4_4_;
    auVar68._0_4_ = fVar218 * auVar62._0_4_;
    auVar68._8_4_ = fVar220 * auVar62._8_4_;
    auVar68._12_4_ = fVar221 * auVar62._12_4_;
    auVar68._16_4_ = auVar62._16_4_ * 0.0;
    auVar68._20_4_ = auVar62._20_4_ * 0.0;
    auVar68._24_4_ = auVar62._24_4_ * 0.0;
    auVar68._28_4_ = auVar75._28_4_;
    auVar50 = vfmadd231ps_fma(auVar66,auVar79,ZEXT1632(auVar50));
    auVar55 = vfmadd231ps_fma(auVar68,auVar79,ZEXT1632(auVar55));
    auVar80._0_4_ = fVar218 * auVar63._0_4_;
    auVar80._4_4_ = fVar219 * auVar63._4_4_;
    auVar80._8_4_ = fVar220 * auVar63._8_4_;
    auVar80._12_4_ = fVar221 * auVar63._12_4_;
    auVar80._16_4_ = auVar63._16_4_ * 0.0;
    auVar80._20_4_ = auVar63._20_4_ * 0.0;
    auVar80._24_4_ = auVar63._24_4_ * 0.0;
    auVar80._28_4_ = 0;
    auVar74._4_4_ = fVar219 * auVar64._4_4_;
    auVar74._0_4_ = fVar218 * auVar64._0_4_;
    auVar74._8_4_ = fVar220 * auVar64._8_4_;
    auVar74._12_4_ = fVar221 * auVar64._12_4_;
    auVar74._16_4_ = auVar64._16_4_ * 0.0;
    auVar74._20_4_ = auVar64._20_4_ * 0.0;
    auVar74._24_4_ = auVar64._24_4_ * 0.0;
    auVar74._28_4_ = auVar63._28_4_;
    auVar38 = vfmadd231ps_fma(auVar80,auVar79,auVar61);
    auVar53 = vfmadd231ps_fma(auVar74,auVar79,auVar62);
    auVar76._28_4_ = auVar62._28_4_;
    auVar76._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * auVar53._12_4_,
                            CONCAT48(fVar220 * auVar53._8_4_,
                                     CONCAT44(fVar219 * auVar53._4_4_,fVar218 * auVar53._0_4_))));
    auVar54 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar221 * auVar38._12_4_,
                                                 CONCAT48(fVar220 * auVar38._8_4_,
                                                          CONCAT44(fVar219 * auVar38._4_4_,
                                                                   fVar218 * auVar38._0_4_)))),
                              auVar79,ZEXT1632(auVar50));
    auVar39 = vfmadd231ps_fma(auVar76,auVar79,ZEXT1632(auVar55));
    auVar75 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar50));
    auVar61 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar55));
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar75 = vmulps_avx512vl(auVar75,auVar62);
    auVar61 = vmulps_avx512vl(auVar61,auVar62);
    auVar138._0_4_ = fVar223 * auVar75._0_4_;
    auVar138._4_4_ = fVar223 * auVar75._4_4_;
    auVar138._8_4_ = fVar223 * auVar75._8_4_;
    auVar138._12_4_ = fVar223 * auVar75._12_4_;
    auVar138._16_4_ = fVar223 * auVar75._16_4_;
    auVar138._20_4_ = fVar223 * auVar75._20_4_;
    auVar138._24_4_ = fVar223 * auVar75._24_4_;
    auVar138._28_4_ = 0;
    auVar75 = vmulps_avx512vl(auVar204,auVar61);
    auVar38 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
    auVar61 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_0205fd20,ZEXT1632(auVar38));
    auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_0205fd20,ZEXT1632(auVar38));
    auVar108._0_4_ = auVar138._0_4_ + auVar54._0_4_;
    auVar108._4_4_ = auVar138._4_4_ + auVar54._4_4_;
    auVar108._8_4_ = auVar138._8_4_ + auVar54._8_4_;
    auVar108._12_4_ = auVar138._12_4_ + auVar54._12_4_;
    auVar108._16_4_ = auVar138._16_4_ + 0.0;
    auVar108._20_4_ = auVar138._20_4_ + 0.0;
    auVar108._24_4_ = auVar138._24_4_ + 0.0;
    auVar108._28_4_ = 0;
    auVar80 = ZEXT1632(auVar38);
    auVar64 = vpermt2ps_avx512vl(auVar138,_DAT_0205fd20,auVar80);
    auVar65 = vaddps_avx512vl(ZEXT1632(auVar39),auVar75);
    auVar66 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,auVar80);
    auVar75 = vsubps_avx(auVar61,auVar64);
    auVar64 = vsubps_avx512vl(auVar63,auVar66);
    auVar66 = vmulps_avx512vl(auVar77,auVar81);
    auVar68 = vmulps_avx512vl(auVar70,auVar81);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar79,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar79,auVar69);
    auVar74 = vmulps_avx512vl(auVar78,auVar81);
    auVar76 = vmulps_avx512vl(auVar71,auVar81);
    auVar77 = vfmadd231ps_avx512vl(auVar74,auVar79,auVar77);
    auVar74 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar70);
    auVar76 = vmulps_avx512vl(auVar72,auVar81);
    auVar67 = vmulps_avx512vl(auVar73,auVar81);
    auVar50 = vfmadd231ps_fma(auVar76,auVar79,auVar78);
    auVar55 = vfmadd231ps_fma(auVar67,auVar79,auVar71);
    auVar76 = vmulps_avx512vl(auVar81,auVar77);
    auVar67 = vmulps_avx512vl(ZEXT1632(auVar41),auVar74);
    auVar66 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar66);
    auVar68 = vfmadd231ps_avx512vl(auVar67,auVar79,auVar68);
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar221 * auVar50._12_4_,
                                            CONCAT48(fVar220 * auVar50._8_4_,
                                                     CONCAT44(fVar219 * auVar50._4_4_,
                                                              fVar218 * auVar50._0_4_)))),auVar79,
                         auVar77);
    auVar74 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar221 * auVar55._12_4_,
                                            CONCAT48(fVar220 * auVar55._8_4_,
                                                     CONCAT44(fVar219 * auVar55._4_4_,
                                                              fVar218 * auVar55._0_4_)))),auVar79,
                         auVar74);
    auVar67._4_4_ = fVar219 * auVar77._4_4_;
    auVar67._0_4_ = fVar218 * auVar77._0_4_;
    auVar67._8_4_ = fVar220 * auVar77._8_4_;
    auVar67._12_4_ = fVar221 * auVar77._12_4_;
    auVar67._16_4_ = auVar77._16_4_ * 0.0;
    auVar67._20_4_ = auVar77._20_4_ * 0.0;
    auVar67._24_4_ = auVar77._24_4_ * 0.0;
    auVar67._28_4_ = auVar71._28_4_;
    auVar69._4_4_ = fVar219 * auVar74._4_4_;
    auVar69._0_4_ = fVar218 * auVar74._0_4_;
    auVar69._8_4_ = fVar220 * auVar74._8_4_;
    auVar69._12_4_ = fVar221 * auVar74._12_4_;
    auVar69._16_4_ = auVar74._16_4_ * 0.0;
    auVar69._20_4_ = auVar74._20_4_ * 0.0;
    auVar69._24_4_ = auVar74._24_4_ * 0.0;
    auVar69._28_4_ = auVar78._28_4_;
    auVar78 = vfmadd231ps_avx512vl(auVar67,auVar79,auVar66);
    auVar76 = vfmadd231ps_avx512vl(auVar69,auVar68,auVar79);
    auVar79 = vsubps_avx512vl(auVar77,auVar66);
    auVar77 = vsubps_avx512vl(auVar74,auVar68);
    auVar79 = vmulps_avx512vl(auVar79,auVar62);
    auVar77 = vmulps_avx512vl(auVar77,auVar62);
    fVar206 = fVar223 * auVar79._0_4_;
    fVar218 = fVar223 * auVar79._4_4_;
    auVar70._4_4_ = fVar218;
    auVar70._0_4_ = fVar206;
    fVar219 = fVar223 * auVar79._8_4_;
    auVar70._8_4_ = fVar219;
    fVar220 = fVar223 * auVar79._12_4_;
    auVar70._12_4_ = fVar220;
    fVar221 = fVar223 * auVar79._16_4_;
    auVar70._16_4_ = fVar221;
    fVar222 = fVar223 * auVar79._20_4_;
    auVar70._20_4_ = fVar222;
    fVar223 = fVar223 * auVar79._24_4_;
    auVar70._24_4_ = fVar223;
    auVar70._28_4_ = auVar79._28_4_;
    auVar77 = vmulps_avx512vl(auVar204,auVar77);
    auVar62 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,auVar80);
    auVar66 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar80);
    auVar205._0_4_ = auVar78._0_4_ + fVar206;
    auVar205._4_4_ = auVar78._4_4_ + fVar218;
    auVar205._8_4_ = auVar78._8_4_ + fVar219;
    auVar205._12_4_ = auVar78._12_4_ + fVar220;
    auVar205._16_4_ = auVar78._16_4_ + fVar221;
    auVar205._20_4_ = auVar78._20_4_ + fVar222;
    auVar205._24_4_ = auVar78._24_4_ + fVar223;
    auVar205._28_4_ = auVar78._28_4_ + auVar79._28_4_;
    auVar79 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,ZEXT1632(auVar38));
    auVar68 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,ZEXT1632(auVar38));
    auVar79 = vsubps_avx(auVar62,auVar79);
    auVar77 = vsubps_avx512vl(auVar66,auVar77);
    auVar127 = ZEXT1632(auVar54);
    auVar74 = vsubps_avx512vl(auVar78,auVar127);
    auVar138 = ZEXT1632(auVar39);
    auVar67 = vsubps_avx512vl(auVar76,auVar138);
    auVar69 = vsubps_avx512vl(auVar62,auVar61);
    auVar74 = vaddps_avx512vl(auVar74,auVar69);
    auVar69 = vsubps_avx512vl(auVar66,auVar63);
    auVar67 = vaddps_avx512vl(auVar67,auVar69);
    auVar69 = vmulps_avx512vl(auVar138,auVar74);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar127,auVar67);
    auVar70 = vmulps_avx512vl(auVar65,auVar74);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar108,auVar67);
    auVar71 = vmulps_avx512vl(auVar64,auVar74);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar75,auVar67);
    auVar72 = vmulps_avx512vl(auVar63,auVar74);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar61,auVar67);
    auVar73 = vmulps_avx512vl(auVar76,auVar74);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar78,auVar67);
    auVar80 = vmulps_avx512vl(auVar68,auVar74);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar205,auVar67);
    auVar81 = vmulps_avx512vl(auVar77,auVar74);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar79,auVar67);
    auVar74 = vmulps_avx512vl(auVar66,auVar74);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar62,auVar67);
    auVar67 = vminps_avx512vl(auVar69,auVar70);
    auVar69 = vmaxps_avx512vl(auVar69,auVar70);
    auVar70 = vminps_avx512vl(auVar71,auVar72);
    auVar67 = vminps_avx512vl(auVar67,auVar70);
    auVar70 = vmaxps_avx512vl(auVar71,auVar72);
    auVar69 = vmaxps_avx512vl(auVar69,auVar70);
    auVar70 = vminps_avx512vl(auVar73,auVar80);
    auVar71 = vmaxps_avx512vl(auVar73,auVar80);
    auVar72 = vminps_avx512vl(auVar81,auVar74);
    auVar70 = vminps_avx512vl(auVar70,auVar72);
    auVar67 = vminps_avx512vl(auVar67,auVar70);
    auVar74 = vmaxps_avx512vl(auVar81,auVar74);
    auVar74 = vmaxps_avx512vl(auVar71,auVar74);
    auVar74 = vmaxps_avx512vl(auVar69,auVar74);
    uVar14 = vcmpps_avx512vl(auVar67,local_78,2);
    uVar15 = vcmpps_avx512vl(auVar74,local_98,5);
    uVar31 = 0;
    bVar23 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar23 != 0) {
      auVar74 = vsubps_avx512vl(auVar61,auVar127);
      auVar67 = vsubps_avx512vl(auVar63,auVar138);
      auVar69 = vsubps_avx512vl(auVar62,auVar78);
      auVar74 = vaddps_avx512vl(auVar74,auVar69);
      auVar69 = vsubps_avx512vl(auVar66,auVar76);
      auVar67 = vaddps_avx512vl(auVar67,auVar69);
      auVar69 = vmulps_avx512vl(auVar138,auVar74);
      auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar67,auVar127);
      auVar65 = vmulps_avx512vl(auVar65,auVar74);
      auVar65 = vfnmadd213ps_avx512vl(auVar108,auVar67,auVar65);
      auVar64 = vmulps_avx512vl(auVar64,auVar74);
      auVar64 = vfnmadd213ps_avx512vl(auVar75,auVar67,auVar64);
      auVar75 = vmulps_avx512vl(auVar63,auVar74);
      auVar63 = vfnmadd231ps_avx512vl(auVar75,auVar67,auVar61);
      auVar75 = vmulps_avx512vl(auVar76,auVar74);
      auVar78 = vfnmadd231ps_avx512vl(auVar75,auVar67,auVar78);
      auVar75 = vmulps_avx512vl(auVar68,auVar74);
      auVar68 = vfnmadd213ps_avx512vl(auVar205,auVar67,auVar75);
      auVar75 = vmulps_avx512vl(auVar77,auVar74);
      auVar76 = vfnmadd213ps_avx512vl(auVar79,auVar67,auVar75);
      auVar79 = vmulps_avx512vl(auVar66,auVar74);
      auVar62 = vfnmadd231ps_avx512vl(auVar79,auVar62,auVar67);
      auVar75 = vminps_avx(auVar69,auVar65);
      auVar79 = vmaxps_avx(auVar69,auVar65);
      auVar61 = vminps_avx(auVar64,auVar63);
      auVar61 = vminps_avx(auVar75,auVar61);
      auVar75 = vmaxps_avx(auVar64,auVar63);
      auVar79 = vmaxps_avx(auVar79,auVar75);
      auVar77 = vminps_avx(auVar78,auVar68);
      auVar75 = vmaxps_avx(auVar78,auVar68);
      auVar78 = vminps_avx(auVar76,auVar62);
      auVar77 = vminps_avx(auVar77,auVar78);
      auVar77 = vminps_avx(auVar61,auVar77);
      auVar61 = vmaxps_avx(auVar76,auVar62);
      auVar75 = vmaxps_avx(auVar75,auVar61);
      auVar79 = vmaxps_avx(auVar79,auVar75);
      uVar14 = vcmpps_avx512vl(auVar79,local_98,5);
      uVar15 = vcmpps_avx512vl(auVar77,local_78,2);
      uVar31 = (uint)(bVar23 & (byte)uVar14 & (byte)uVar15);
    }
    if (uVar31 != 0) {
      auStack_158[uVar25] = uVar31;
      uVar14 = vmovlps_avx(auVar40);
      *(undefined8 *)(&uStack_b8 + uVar25 * 2) = uVar14;
      uVar28 = vmovlps_avx(auVar56);
      auStack_58[uVar25] = uVar28;
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar258 = ZEXT3264(auVar79);
    auVar260 = ZEXT1664(local_2e8);
    in_ZMM31 = ZEXT1664(local_2f8);
    auVar257 = ZEXT1664(local_318);
    do {
      auVar41 = auVar263._0_16_;
      auVar40 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar25 == 0) {
        if (bVar34) {
          return local_379;
        }
        fVar223 = ray->tfar;
        auVar22._4_4_ = fVar223;
        auVar22._0_4_ = fVar223;
        auVar22._8_4_ = fVar223;
        auVar22._12_4_ = fVar223;
        uVar14 = vcmpps_avx512vl(local_d8,auVar22,2);
        uVar33 = (uint)uVar35 & (uint)lVar32 & (uint)uVar14;
        uVar35 = (ulong)uVar33;
        local_379 = uVar33 != 0;
        if (!local_379) {
          return local_379;
        }
        goto LAB_01c573df;
      }
      uVar24 = (int)uVar25 - 1;
      uVar26 = (ulong)uVar24;
      uVar31 = (&uStack_b8)[uVar26 * 2];
      fVar223 = afStack_b4[uVar26 * 2];
      uVar6 = auStack_158[uVar26];
      auVar255._8_8_ = 0;
      auVar255._0_8_ = auStack_58[uVar26];
      auVar256 = ZEXT1664(auVar255);
      lVar30 = 0;
      for (uVar28 = (ulong)uVar6; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar27 = uVar6 - 1 & uVar6;
      auStack_158[uVar26] = uVar27;
      if (uVar27 == 0) {
        uVar25 = (ulong)uVar24;
      }
      auVar112._0_4_ = (float)lVar30;
      auVar112._4_8_ = SUB128(ZEXT812(0),4);
      auVar112._12_4_ = 0;
      auVar50 = vmulss_avx512f(auVar112,SUB6416(ZEXT464(0x3e124925),0));
      lVar30 = lVar30 + 1;
      auVar55 = vmulss_avx512f(ZEXT416((uint)(float)lVar30),SUB6416(ZEXT464(0x3e124925),0));
      auVar53 = auVar261._0_16_;
      auVar38 = vsubss_avx512f(auVar53,auVar50);
      auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar50._0_4_)),ZEXT416(uVar31),auVar38);
      auVar38 = vsubss_avx512f(auVar53,auVar55);
      auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar55._0_4_)),ZEXT416(uVar31),auVar38);
      fVar206 = auVar55._0_4_;
      fVar218 = auVar50._0_4_;
      fVar223 = fVar206 - fVar218;
      vucomiss_avx512f(ZEXT416((uint)fVar223));
      if (uVar6 == 0 || lVar30 == 0) break;
      auVar38 = vshufps_avx(auVar255,auVar255,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar223));
      uVar31 = (uint)uVar25;
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = &DAT_3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar54 = vsubps_avx(auVar113,auVar38);
      fVar219 = auVar38._0_4_;
      auVar122._0_4_ = fVar219 * (float)local_1a8._0_4_;
      fVar220 = auVar38._4_4_;
      auVar122._4_4_ = fVar220 * (float)local_1a8._4_4_;
      fVar221 = auVar38._8_4_;
      auVar122._8_4_ = fVar221 * fStack_1a0;
      fVar222 = auVar38._12_4_;
      auVar122._12_4_ = fVar222 * fStack_19c;
      auVar135._0_4_ = fVar219 * (float)local_1b8._0_4_;
      auVar135._4_4_ = fVar220 * (float)local_1b8._4_4_;
      auVar135._8_4_ = fVar221 * fStack_1b0;
      auVar135._12_4_ = fVar222 * fStack_1ac;
      auVar148._0_4_ = fVar219 * (float)local_1c8._0_4_;
      auVar148._4_4_ = fVar220 * (float)local_1c8._4_4_;
      auVar148._8_4_ = fVar221 * fStack_1c0;
      auVar148._12_4_ = fVar222 * fStack_1bc;
      auVar103._0_4_ = fVar219 * (float)local_1d8._0_4_;
      auVar103._4_4_ = fVar220 * (float)local_1d8._4_4_;
      auVar103._8_4_ = fVar221 * fStack_1d0;
      auVar103._12_4_ = fVar222 * fStack_1cc;
      auVar38 = vfmadd231ps_fma(auVar122,auVar54,local_168);
      auVar39 = vfmadd231ps_fma(auVar135,auVar54,local_178);
      auVar56 = vfmadd231ps_fma(auVar148,auVar54,local_188);
      auVar54 = vfmadd231ps_fma(auVar103,auVar54,local_198);
      auVar120._16_16_ = auVar38;
      auVar120._0_16_ = auVar38;
      auVar128._16_16_ = auVar39;
      auVar128._0_16_ = auVar39;
      auVar139._16_16_ = auVar56;
      auVar139._0_16_ = auVar56;
      auVar166._4_4_ = fVar218;
      auVar166._0_4_ = fVar218;
      auVar166._8_4_ = fVar218;
      auVar166._12_4_ = fVar218;
      auVar166._20_4_ = fVar206;
      auVar166._16_4_ = fVar206;
      auVar166._24_4_ = fVar206;
      auVar166._28_4_ = fVar206;
      auVar79 = vsubps_avx(auVar128,auVar120);
      auVar39 = vfmadd213ps_fma(auVar79,auVar166,auVar120);
      auVar79 = vsubps_avx(auVar139,auVar128);
      auVar57 = vfmadd213ps_fma(auVar79,auVar166,auVar128);
      auVar38 = vsubps_avx(auVar54,auVar56);
      auVar129._16_16_ = auVar38;
      auVar129._0_16_ = auVar38;
      auVar38 = vfmadd213ps_fma(auVar129,auVar166,auVar139);
      auVar79 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar39));
      auVar54 = vfmadd213ps_fma(auVar79,auVar166,ZEXT1632(auVar39));
      auVar79 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar57));
      auVar38 = vfmadd213ps_fma(auVar79,auVar166,ZEXT1632(auVar57));
      auVar79 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar54));
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar79,auVar166);
      auVar79 = vmulps_avx512vl(auVar79,auVar258._0_32_);
      auVar38 = vmulss_avx512f(ZEXT416((uint)fVar223),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar206 = auVar38._0_4_;
      auVar149._0_8_ =
           CONCAT44(auVar46._4_4_ + fVar206 * auVar79._4_4_,auVar46._0_4_ + fVar206 * auVar79._0_4_)
      ;
      auVar149._8_4_ = auVar46._8_4_ + fVar206 * auVar79._8_4_;
      auVar149._12_4_ = auVar46._12_4_ + fVar206 * auVar79._12_4_;
      auVar123._0_4_ = fVar206 * auVar79._16_4_;
      auVar123._4_4_ = fVar206 * auVar79._20_4_;
      auVar123._8_4_ = fVar206 * auVar79._24_4_;
      auVar123._12_4_ = fVar206 * auVar79._28_4_;
      auVar44 = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar60 = vshufpd_avx(auVar46,auVar46,3);
      auVar36 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar38 = vsubps_avx(auVar60,auVar46);
      auVar54 = vsubps_avx(auVar36,(undefined1  [16])0x0);
      auVar171._0_4_ = auVar54._0_4_ + auVar38._0_4_;
      auVar171._4_4_ = auVar54._4_4_ + auVar38._4_4_;
      auVar171._8_4_ = auVar54._8_4_ + auVar38._8_4_;
      auVar171._12_4_ = auVar54._12_4_ + auVar38._12_4_;
      auVar38 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar54 = vshufps_avx(auVar149,auVar149,0xb1);
      auVar39 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar232._4_4_ = auVar171._0_4_;
      auVar232._0_4_ = auVar171._0_4_;
      auVar232._8_4_ = auVar171._0_4_;
      auVar232._12_4_ = auVar171._0_4_;
      auVar57 = vshufps_avx(auVar171,auVar171,0x55);
      fVar206 = auVar57._0_4_;
      auVar190._0_4_ = auVar38._0_4_ * fVar206;
      fVar218 = auVar57._4_4_;
      auVar190._4_4_ = auVar38._4_4_ * fVar218;
      fVar219 = auVar57._8_4_;
      auVar190._8_4_ = auVar38._8_4_ * fVar219;
      fVar220 = auVar57._12_4_;
      auVar190._12_4_ = auVar38._12_4_ * fVar220;
      auVar201._0_4_ = auVar54._0_4_ * fVar206;
      auVar201._4_4_ = auVar54._4_4_ * fVar218;
      auVar201._8_4_ = auVar54._8_4_ * fVar219;
      auVar201._12_4_ = auVar54._12_4_ * fVar220;
      auVar210._0_4_ = auVar39._0_4_ * fVar206;
      auVar210._4_4_ = auVar39._4_4_ * fVar218;
      auVar210._8_4_ = auVar39._8_4_ * fVar219;
      auVar210._12_4_ = auVar39._12_4_ * fVar220;
      auVar172._0_4_ = auVar56._0_4_ * fVar206;
      auVar172._4_4_ = auVar56._4_4_ * fVar218;
      auVar172._8_4_ = auVar56._8_4_ * fVar219;
      auVar172._12_4_ = auVar56._12_4_ * fVar220;
      auVar38 = vfmadd231ps_fma(auVar190,auVar232,auVar46);
      auVar54 = vfmadd231ps_fma(auVar201,auVar232,auVar149);
      auVar57 = vfmadd231ps_fma(auVar210,auVar232,auVar44);
      auVar45 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar232);
      auVar58 = vshufpd_avx(auVar38,auVar38,1);
      auVar59 = vshufpd_avx(auVar54,auVar54,1);
      auVar42 = vshufpd_avx(auVar57,auVar57,1);
      auVar43 = vshufpd_avx(auVar45,auVar45,1);
      auVar39 = vminss_avx(auVar38,auVar54);
      auVar38 = vmaxss_avx(auVar54,auVar38);
      auVar56 = vminss_avx(auVar57,auVar45);
      auVar54 = vmaxss_avx(auVar45,auVar57);
      auVar56 = vminss_avx(auVar39,auVar56);
      auVar38 = vmaxss_avx(auVar54,auVar38);
      auVar57 = vminss_avx(auVar58,auVar59);
      auVar54 = vmaxss_avx(auVar59,auVar58);
      auVar58 = vminss_avx(auVar42,auVar43);
      auVar39 = vmaxss_avx(auVar43,auVar42);
      auVar57 = vminss_avx(auVar57,auVar58);
      auVar54 = vmaxss_avx(auVar39,auVar54);
      vucomiss_avx512f(auVar56);
      if ((uVar31 < 5) || (auVar54 = vucomiss_avx512f(auVar40), uVar31 < 5)) {
        auVar38 = vucomiss_avx512f(auVar40);
        uVar14 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar15 = vcmpps_avx512vl(auVar56,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar31 & ((byte)uVar15 | (byte)uVar14)) != 0) goto LAB_01c58678;
        uVar14 = vcmpps_avx512vl(auVar40,auVar54,5);
        uVar15 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar15 | (ushort)uVar14) & 1) == 0) goto LAB_01c58678;
LAB_01c592ca:
        bVar16 = true;
        auVar256 = ZEXT1664(auVar255);
      }
      else {
LAB_01c58678:
        uVar14 = vcmpss_avx512f(auVar56,auVar41,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        iVar93 = auVar261._0_4_;
        fVar206 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar93);
        uVar14 = vcmpss_avx512f(auVar38,auVar41,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar218 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar93);
        bVar16 = fVar206 != fVar218;
        iVar262 = auVar263._0_4_;
        auVar79._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar82._4_28_ = auVar79._4_28_;
        auVar82._0_4_ = (uint)bVar16 * iVar262 + (uint)!bVar16 * 0x7f800000;
        auVar39 = auVar82._0_16_;
        auVar84._16_16_ = auVar79._16_16_;
        auVar84._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar16 * iVar262 + (uint)!bVar16 * -0x800000;
        auVar40 = auVar83._0_16_;
        uVar14 = vcmpss_avx512f(auVar57,auVar41,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar219 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar93);
        if ((fVar206 != fVar219) || (NAN(fVar206) || NAN(fVar219))) {
          fVar220 = auVar57._0_4_;
          fVar206 = auVar56._0_4_;
          bVar16 = fVar220 == fVar206;
          if ((!bVar16) || (NAN(fVar220) || NAN(fVar206))) {
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar56 = vxorps_avx512vl(auVar56,auVar21);
            auVar248._0_4_ = auVar56._0_4_ / (fVar220 - fVar206);
            auVar248._4_12_ = auVar56._4_12_;
            auVar56 = vsubss_avx512f(auVar53,auVar248);
            auVar57 = vfmadd213ss_avx512f(auVar56,auVar41,auVar248);
            auVar56 = auVar57;
          }
          else {
            vucomiss_avx512f(auVar41);
            auVar86._16_16_ = auVar79._16_16_;
            auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ = (uint)bVar16 * iVar262 + (uint)!bVar16 * 0x7f800000;
            auVar57 = auVar85._0_16_;
            auVar56 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar39 = vminss_avx(auVar39,auVar57);
          auVar40 = vmaxss_avx(auVar56,auVar40);
        }
        uVar14 = vcmpss_avx512f(auVar54,auVar41,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar206 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar93);
        if ((fVar218 != fVar206) || (NAN(fVar218) || NAN(fVar206))) {
          fVar220 = auVar54._0_4_;
          fVar218 = auVar38._0_4_;
          bVar16 = fVar220 == fVar218;
          if ((!bVar16) || (NAN(fVar220) || NAN(fVar218))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar38 = vxorps_avx512vl(auVar38,auVar20);
            auVar211._0_4_ = auVar38._0_4_ / (fVar220 - fVar218);
            auVar211._4_12_ = auVar38._4_12_;
            auVar38 = vsubss_avx512f(auVar53,auVar211);
            auVar54 = vfmadd213ss_avx512f(auVar38,auVar41,auVar211);
            auVar38 = auVar54;
          }
          else {
            vucomiss_avx512f(auVar41);
            auVar88._16_16_ = auVar79._16_16_;
            auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar87._4_28_ = auVar88._4_28_;
            auVar87._0_4_ = (uint)bVar16 * iVar262 + (uint)!bVar16 * 0x7f800000;
            auVar54 = auVar87._0_16_;
            auVar38 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar39 = vminss_avx(auVar39,auVar54);
          auVar40 = vmaxss_avx(auVar38,auVar40);
        }
        bVar16 = fVar219 != fVar206;
        auVar38 = vminss_avx512f(auVar39,auVar53);
        auVar90._16_16_ = auVar79._16_16_;
        auVar90._0_16_ = auVar39;
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar16 * auVar38._0_4_ + (uint)!bVar16 * auVar39._0_4_;
        auVar38 = vmaxss_avx512f(auVar53,auVar40);
        auVar92._16_16_ = auVar79._16_16_;
        auVar92._0_16_ = auVar40;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar16 * auVar38._0_4_ + (uint)!bVar16 * auVar40._0_4_;
        auVar40 = vmaxss_avx512f(auVar41,auVar89._0_16_);
        auVar38 = vminss_avx512f(auVar91._0_16_,auVar53);
        bVar16 = true;
        if (auVar38._0_4_ < auVar40._0_4_) goto LAB_01c592ca;
        auVar59 = vmaxss_avx512f(auVar41,ZEXT416((uint)(auVar40._0_4_ + -0.1)));
        auVar42 = vminss_avx512f(ZEXT416((uint)(auVar38._0_4_ + 0.1)),auVar53);
        auVar104._0_8_ = auVar46._0_8_;
        auVar104._8_8_ = auVar104._0_8_;
        auVar202._8_8_ = auVar149._0_8_;
        auVar202._0_8_ = auVar149._0_8_;
        auVar212._8_8_ = auVar44._0_8_;
        auVar212._0_8_ = auVar44._0_8_;
        auVar40 = vshufpd_avx(auVar149,auVar149,3);
        auVar38 = vshufpd_avx(auVar44,auVar44,3);
        auVar54 = vshufps_avx(auVar59,auVar42,0);
        auVar233._8_4_ = 0x3f800000;
        auVar233._0_8_ = &DAT_3f8000003f800000;
        auVar233._12_4_ = 0x3f800000;
        auVar39 = vsubps_avx(auVar233,auVar54);
        fVar206 = auVar54._0_4_;
        auVar242._0_4_ = fVar206 * auVar60._0_4_;
        fVar218 = auVar54._4_4_;
        auVar242._4_4_ = fVar218 * auVar60._4_4_;
        fVar219 = auVar54._8_4_;
        auVar242._8_4_ = fVar219 * auVar60._8_4_;
        fVar220 = auVar54._12_4_;
        auVar242._12_4_ = fVar220 * auVar60._12_4_;
        auVar150._0_4_ = fVar206 * auVar40._0_4_;
        auVar150._4_4_ = fVar218 * auVar40._4_4_;
        auVar150._8_4_ = fVar219 * auVar40._8_4_;
        auVar150._12_4_ = fVar220 * auVar40._12_4_;
        auVar163._0_4_ = fVar206 * auVar38._0_4_;
        auVar163._4_4_ = fVar218 * auVar38._4_4_;
        auVar163._8_4_ = fVar219 * auVar38._8_4_;
        auVar163._12_4_ = fVar220 * auVar38._12_4_;
        auVar124._0_4_ = fVar206 * auVar36._0_4_;
        auVar124._4_4_ = fVar218 * auVar36._4_4_;
        auVar124._8_4_ = fVar219 * auVar36._8_4_;
        auVar124._12_4_ = fVar220 * auVar36._12_4_;
        auVar56 = vfmadd231ps_fma(auVar242,auVar39,auVar104);
        auVar57 = vfmadd231ps_fma(auVar150,auVar39,auVar202);
        auVar58 = vfmadd231ps_fma(auVar163,auVar39,auVar212);
        auVar60 = vfmadd231ps_fma(auVar124,auVar39,ZEXT816(0));
        auVar38 = vsubss_avx512f(auVar53,auVar59);
        auVar40 = vmovshdup_avx(auVar255);
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar59._0_4_)),auVar255,auVar38);
        auVar38 = vsubss_avx512f(auVar53,auVar42);
        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar40._0_4_)),auVar255,auVar38);
        auVar36 = vdivss_avx512f(auVar53,ZEXT416((uint)fVar223));
        auVar40 = vsubps_avx(auVar57,auVar56);
        auVar114._0_4_ = auVar40._0_4_ * 3.0;
        auVar114._4_4_ = auVar40._4_4_ * 3.0;
        auVar114._8_4_ = auVar40._8_4_ * 3.0;
        auVar114._12_4_ = auVar40._12_4_ * 3.0;
        auVar40 = vsubps_avx(auVar58,auVar57);
        auVar173._0_4_ = auVar40._0_4_ * 3.0;
        auVar173._4_4_ = auVar40._4_4_ * 3.0;
        auVar173._8_4_ = auVar40._8_4_ * 3.0;
        auVar173._12_4_ = auVar40._12_4_ * 3.0;
        auVar40 = vsubps_avx(auVar60,auVar58);
        auVar191._0_4_ = auVar40._0_4_ * 3.0;
        auVar191._4_4_ = auVar40._4_4_ * 3.0;
        auVar191._8_4_ = auVar40._8_4_ * 3.0;
        auVar191._12_4_ = auVar40._12_4_ * 3.0;
        auVar38 = vminps_avx(auVar173,auVar191);
        auVar40 = vmaxps_avx(auVar173,auVar191);
        auVar38 = vminps_avx(auVar114,auVar38);
        auVar40 = vmaxps_avx(auVar114,auVar40);
        auVar54 = vshufpd_avx(auVar38,auVar38,3);
        auVar39 = vshufpd_avx(auVar40,auVar40,3);
        auVar38 = vminps_avx(auVar38,auVar54);
        auVar40 = vmaxps_avx(auVar40,auVar39);
        fVar223 = auVar36._0_4_;
        auVar192._0_4_ = fVar223 * auVar38._0_4_;
        auVar192._4_4_ = fVar223 * auVar38._4_4_;
        auVar192._8_4_ = fVar223 * auVar38._8_4_;
        auVar192._12_4_ = fVar223 * auVar38._12_4_;
        auVar174._0_4_ = fVar223 * auVar40._0_4_;
        auVar174._4_4_ = fVar223 * auVar40._4_4_;
        auVar174._8_4_ = fVar223 * auVar40._8_4_;
        auVar174._12_4_ = fVar223 * auVar40._12_4_;
        auVar36 = vdivss_avx512f(auVar53,ZEXT416((uint)(auVar46._0_4_ - auVar45._0_4_)));
        auVar40 = vshufpd_avx(auVar56,auVar56,3);
        auVar38 = vshufpd_avx(auVar57,auVar57,3);
        auVar54 = vshufpd_avx(auVar58,auVar58,3);
        auVar39 = vshufpd_avx(auVar60,auVar60,3);
        auVar40 = vsubps_avx(auVar40,auVar56);
        auVar56 = vsubps_avx(auVar38,auVar57);
        auVar57 = vsubps_avx(auVar54,auVar58);
        auVar39 = vsubps_avx(auVar39,auVar60);
        auVar38 = vminps_avx(auVar40,auVar56);
        auVar40 = vmaxps_avx(auVar40,auVar56);
        auVar54 = vminps_avx(auVar57,auVar39);
        auVar54 = vminps_avx(auVar38,auVar54);
        auVar38 = vmaxps_avx(auVar57,auVar39);
        auVar40 = vmaxps_avx(auVar40,auVar38);
        fVar223 = auVar36._0_4_;
        auVar213._0_4_ = fVar223 * auVar54._0_4_;
        auVar213._4_4_ = fVar223 * auVar54._4_4_;
        auVar213._8_4_ = fVar223 * auVar54._8_4_;
        auVar213._12_4_ = fVar223 * auVar54._12_4_;
        auVar226._0_4_ = fVar223 * auVar40._0_4_;
        auVar226._4_4_ = fVar223 * auVar40._4_4_;
        auVar226._8_4_ = fVar223 * auVar40._8_4_;
        auVar226._12_4_ = fVar223 * auVar40._12_4_;
        auVar44 = vinsertps_avx512f(auVar50,auVar45,0x10);
        auVar56 = vinsertps_avx(auVar55,auVar46,0x10);
        auVar98._0_4_ = auVar44._0_4_ + auVar56._0_4_;
        auVar98._4_4_ = auVar44._4_4_ + auVar56._4_4_;
        auVar98._8_4_ = auVar44._8_4_ + auVar56._8_4_;
        auVar98._12_4_ = auVar44._12_4_ + auVar56._12_4_;
        auVar18._8_4_ = 0x3f000000;
        auVar18._0_8_ = 0x3f0000003f000000;
        auVar18._12_4_ = 0x3f000000;
        auVar42 = vmulps_avx512vl(auVar98,auVar18);
        auVar54 = vshufps_avx(auVar42,auVar42,0x54);
        uVar94 = auVar42._0_4_;
        auVar115._4_4_ = uVar94;
        auVar115._0_4_ = uVar94;
        auVar115._8_4_ = uVar94;
        auVar115._12_4_ = uVar94;
        auVar39 = vfmadd213ps_avx512vl(auVar260._0_16_,auVar115,auVar37);
        auVar57 = vfmadd213ps_avx512vl(in_ZMM31._0_16_,auVar115,auVar257._0_16_);
        auVar38 = vfmadd213ps_fma(local_c8,auVar115,local_308);
        auVar40 = vsubps_avx(auVar57,auVar39);
        auVar39 = vfmadd213ps_fma(auVar40,auVar115,auVar39);
        auVar40 = vsubps_avx(auVar38,auVar57);
        auVar40 = vfmadd213ps_fma(auVar40,auVar115,auVar57);
        auVar40 = vsubps_avx(auVar40,auVar39);
        auVar38 = vfmadd231ps_fma(auVar39,auVar40,auVar115);
        auVar116._0_8_ = CONCAT44(auVar40._4_4_ * 3.0,auVar40._0_4_ * 3.0);
        auVar116._8_4_ = auVar40._8_4_ * 3.0;
        auVar116._12_4_ = auVar40._12_4_ * 3.0;
        auVar234._8_8_ = auVar38._0_8_;
        auVar234._0_8_ = auVar38._0_8_;
        auVar40 = vshufpd_avx(auVar38,auVar38,3);
        auVar38 = vshufps_avx(auVar42,auVar42,0x55);
        auVar39 = vsubps_avx(auVar40,auVar234);
        auVar57 = vfmadd231ps_fma(auVar234,auVar38,auVar39);
        auVar249._8_8_ = auVar116._0_8_;
        auVar249._0_8_ = auVar116._0_8_;
        auVar40 = vshufpd_avx(auVar116,auVar116,3);
        auVar40 = vsubps_avx(auVar40,auVar249);
        auVar38 = vfmadd213ps_fma(auVar40,auVar38,auVar249);
        auVar117._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
        auVar117._8_4_ = auVar39._8_4_ ^ 0x80000000;
        auVar117._12_4_ = auVar39._12_4_ ^ 0x80000000;
        auVar40 = vmovshdup_avx(auVar38);
        auVar250._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
        auVar250._8_4_ = auVar40._8_4_ ^ 0x80000000;
        auVar250._12_4_ = auVar40._12_4_ ^ 0x80000000;
        auVar58 = vmovshdup_avx512vl(auVar39);
        auVar60 = vpermt2ps_avx512vl(auVar250,ZEXT416(5),auVar39);
        auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar39._0_4_)),auVar38,auVar58
                                     );
        auVar38 = vpermt2ps_avx512vl(auVar38,SUB6416(ZEXT464(4),0),auVar117);
        auVar125._0_4_ = auVar40._0_4_;
        auVar125._4_4_ = auVar125._0_4_;
        auVar125._8_4_ = auVar125._0_4_;
        auVar125._12_4_ = auVar125._0_4_;
        auVar40 = vdivps_avx(auVar60,auVar125);
        auVar38 = vdivps_avx(auVar38,auVar125);
        fVar206 = auVar57._0_4_;
        auVar39 = vshufps_avx(auVar57,auVar57,0x55);
        fVar223 = auVar38._0_4_;
        auVar235._0_4_ = fVar206 * auVar40._0_4_ + auVar39._0_4_ * fVar223;
        auVar235._4_4_ = fVar206 * auVar40._4_4_ + auVar39._4_4_ * auVar38._4_4_;
        auVar235._8_4_ = fVar206 * auVar40._8_4_ + auVar39._8_4_ * auVar38._8_4_;
        auVar235._12_4_ = fVar206 * auVar40._12_4_ + auVar39._12_4_ * auVar38._12_4_;
        auVar43 = vsubps_avx(auVar54,auVar235);
        auVar57 = vmovshdup_avx(auVar40);
        auVar54 = vinsertps_avx(auVar192,auVar213,0x1c);
        auVar251._0_4_ = auVar57._0_4_ * auVar54._0_4_;
        auVar251._4_4_ = auVar57._4_4_ * auVar54._4_4_;
        auVar251._8_4_ = auVar57._8_4_ * auVar54._8_4_;
        auVar251._12_4_ = auVar57._12_4_ * auVar54._12_4_;
        auVar39 = vinsertps_avx(auVar174,auVar226,0x1c);
        auVar236._0_4_ = auVar57._0_4_ * auVar39._0_4_;
        auVar236._4_4_ = auVar57._4_4_ * auVar39._4_4_;
        auVar236._8_4_ = auVar57._8_4_ * auVar39._8_4_;
        auVar236._12_4_ = auVar57._12_4_ * auVar39._12_4_;
        auVar59 = vminps_avx512vl(auVar251,auVar236);
        auVar60 = vmaxps_avx(auVar236,auVar251);
        auVar36 = vmovshdup_avx(auVar38);
        auVar57 = vinsertps_avx(auVar213,auVar192,0x4c);
        auVar214._0_4_ = auVar36._0_4_ * auVar57._0_4_;
        auVar214._4_4_ = auVar36._4_4_ * auVar57._4_4_;
        auVar214._8_4_ = auVar36._8_4_ * auVar57._8_4_;
        auVar214._12_4_ = auVar36._12_4_ * auVar57._12_4_;
        auVar58 = vinsertps_avx(auVar226,auVar174,0x4c);
        auVar227._0_4_ = auVar36._0_4_ * auVar58._0_4_;
        auVar227._4_4_ = auVar36._4_4_ * auVar58._4_4_;
        auVar227._8_4_ = auVar36._8_4_ * auVar58._8_4_;
        auVar227._12_4_ = auVar36._12_4_ * auVar58._12_4_;
        auVar36 = vminps_avx(auVar214,auVar227);
        auVar59 = vaddps_avx512vl(auVar59,auVar36);
        auVar36 = vmaxps_avx(auVar227,auVar214);
        auVar215._0_4_ = auVar60._0_4_ + auVar36._0_4_;
        auVar215._4_4_ = auVar60._4_4_ + auVar36._4_4_;
        auVar215._8_4_ = auVar60._8_4_ + auVar36._8_4_;
        auVar215._12_4_ = auVar60._12_4_ + auVar36._12_4_;
        auVar228._8_8_ = 0x3f80000000000000;
        auVar228._0_8_ = 0x3f80000000000000;
        auVar60 = vsubps_avx(auVar228,auVar215);
        auVar36 = vsubps_avx(auVar228,auVar59);
        auVar59 = vsubps_avx(auVar44,auVar42);
        auVar42 = vsubps_avx(auVar56,auVar42);
        fVar221 = auVar59._0_4_;
        auVar252._0_4_ = fVar221 * auVar60._0_4_;
        fVar222 = auVar59._4_4_;
        auVar252._4_4_ = fVar222 * auVar60._4_4_;
        fVar167 = auVar59._8_4_;
        auVar252._8_4_ = fVar167 * auVar60._8_4_;
        fVar182 = auVar59._12_4_;
        auVar252._12_4_ = fVar182 * auVar60._12_4_;
        auVar47 = vbroadcastss_avx512vl(auVar40);
        auVar54 = vmulps_avx512vl(auVar47,auVar54);
        auVar39 = vmulps_avx512vl(auVar47,auVar39);
        auVar47 = vminps_avx512vl(auVar54,auVar39);
        auVar54 = vmaxps_avx(auVar39,auVar54);
        auVar193._0_4_ = fVar223 * auVar57._0_4_;
        auVar193._4_4_ = fVar223 * auVar57._4_4_;
        auVar193._8_4_ = fVar223 * auVar57._8_4_;
        auVar193._12_4_ = fVar223 * auVar57._12_4_;
        auVar175._0_4_ = fVar223 * auVar58._0_4_;
        auVar175._4_4_ = fVar223 * auVar58._4_4_;
        auVar175._8_4_ = fVar223 * auVar58._8_4_;
        auVar175._12_4_ = fVar223 * auVar58._12_4_;
        auVar39 = vminps_avx(auVar193,auVar175);
        auVar57 = vaddps_avx512vl(auVar47,auVar39);
        auVar58 = vmulps_avx512vl(auVar59,auVar36);
        fVar206 = auVar42._0_4_;
        auVar216._0_4_ = fVar206 * auVar60._0_4_;
        fVar218 = auVar42._4_4_;
        auVar216._4_4_ = fVar218 * auVar60._4_4_;
        fVar219 = auVar42._8_4_;
        auVar216._8_4_ = fVar219 * auVar60._8_4_;
        fVar220 = auVar42._12_4_;
        auVar216._12_4_ = fVar220 * auVar60._12_4_;
        auVar229._0_4_ = fVar206 * auVar36._0_4_;
        auVar229._4_4_ = fVar218 * auVar36._4_4_;
        auVar229._8_4_ = fVar219 * auVar36._8_4_;
        auVar229._12_4_ = fVar220 * auVar36._12_4_;
        auVar39 = vmaxps_avx(auVar175,auVar193);
        auVar176._0_4_ = auVar54._0_4_ + auVar39._0_4_;
        auVar176._4_4_ = auVar54._4_4_ + auVar39._4_4_;
        auVar176._8_4_ = auVar54._8_4_ + auVar39._8_4_;
        auVar176._12_4_ = auVar54._12_4_ + auVar39._12_4_;
        auVar194._8_8_ = 0x3f800000;
        auVar194._0_8_ = 0x3f800000;
        auVar54 = vsubps_avx(auVar194,auVar176);
        auVar39 = vsubps_avx(auVar194,auVar57);
        auVar243._0_4_ = fVar221 * auVar54._0_4_;
        auVar243._4_4_ = fVar222 * auVar54._4_4_;
        auVar243._8_4_ = fVar167 * auVar54._8_4_;
        auVar243._12_4_ = fVar182 * auVar54._12_4_;
        auVar237._0_4_ = fVar221 * auVar39._0_4_;
        auVar237._4_4_ = fVar222 * auVar39._4_4_;
        auVar237._8_4_ = fVar167 * auVar39._8_4_;
        auVar237._12_4_ = fVar182 * auVar39._12_4_;
        auVar177._0_4_ = fVar206 * auVar54._0_4_;
        auVar177._4_4_ = fVar218 * auVar54._4_4_;
        auVar177._8_4_ = fVar219 * auVar54._8_4_;
        auVar177._12_4_ = fVar220 * auVar54._12_4_;
        auVar195._0_4_ = fVar206 * auVar39._0_4_;
        auVar195._4_4_ = fVar218 * auVar39._4_4_;
        auVar195._8_4_ = fVar219 * auVar39._8_4_;
        auVar195._12_4_ = fVar220 * auVar39._12_4_;
        auVar54 = vminps_avx(auVar243,auVar237);
        auVar39 = vminps_avx(auVar177,auVar195);
        auVar57 = vminps_avx(auVar54,auVar39);
        auVar54 = vmaxps_avx(auVar237,auVar243);
        auVar39 = vmaxps_avx(auVar195,auVar177);
        auVar39 = vmaxps_avx(auVar39,auVar54);
        auVar60 = vminps_avx512vl(auVar252,auVar58);
        auVar54 = vminps_avx(auVar216,auVar229);
        auVar54 = vminps_avx(auVar60,auVar54);
        auVar54 = vhaddps_avx(auVar57,auVar54);
        auVar58 = vmaxps_avx512vl(auVar58,auVar252);
        auVar57 = vmaxps_avx(auVar229,auVar216);
        auVar57 = vmaxps_avx(auVar57,auVar58);
        auVar39 = vhaddps_avx(auVar39,auVar57);
        auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
        auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
        auVar178._0_4_ = auVar54._0_4_ + auVar43._0_4_;
        auVar178._4_4_ = auVar54._4_4_ + auVar43._4_4_;
        auVar178._8_4_ = auVar54._8_4_ + auVar43._8_4_;
        auVar178._12_4_ = auVar54._12_4_ + auVar43._12_4_;
        auVar196._0_4_ = auVar39._0_4_ + auVar43._0_4_;
        auVar196._4_4_ = auVar39._4_4_ + auVar43._4_4_;
        auVar196._8_4_ = auVar39._8_4_ + auVar43._8_4_;
        auVar196._12_4_ = auVar39._12_4_ + auVar43._12_4_;
        auVar54 = vmaxps_avx(auVar44,auVar178);
        auVar39 = vminps_avx(auVar196,auVar56);
        uVar28 = vcmpps_avx512vl(auVar39,auVar54,1);
        local_2d8 = vinsertps_avx(auVar45,auVar46,0x10);
        auVar256 = ZEXT1664(local_2d8);
        if ((uVar28 & 3) == 0) {
          vucomiss_avx512f(auVar50);
          auVar257 = ZEXT1664(local_318);
          if (uVar31 < 4 && (uVar6 == 0 || lVar30 == 0)) {
            bVar16 = false;
          }
          else {
            lVar30 = 200;
            do {
              auVar54 = vsubss_avx512f(auVar53,auVar43);
              fVar219 = auVar54._0_4_;
              fVar206 = fVar219 * fVar219 * fVar219;
              fVar220 = auVar43._0_4_;
              fVar218 = fVar220 * 3.0 * fVar219 * fVar219;
              fVar219 = fVar219 * fVar220 * fVar220 * 3.0;
              auVar151._4_4_ = fVar206;
              auVar151._0_4_ = fVar206;
              auVar151._8_4_ = fVar206;
              auVar151._12_4_ = fVar206;
              auVar136._4_4_ = fVar218;
              auVar136._0_4_ = fVar218;
              auVar136._8_4_ = fVar218;
              auVar136._12_4_ = fVar218;
              auVar105._4_4_ = fVar219;
              auVar105._0_4_ = fVar219;
              auVar105._8_4_ = fVar219;
              auVar105._12_4_ = fVar219;
              fVar220 = fVar220 * fVar220 * fVar220;
              auVar164._0_4_ = (float)local_1e8._0_4_ * fVar220;
              auVar164._4_4_ = (float)local_1e8._4_4_ * fVar220;
              auVar164._8_4_ = fStack_1e0 * fVar220;
              auVar164._12_4_ = fStack_1dc * fVar220;
              auVar54 = vfmadd231ps_fma(auVar164,local_308,auVar105);
              auVar54 = vfmadd231ps_avx512vl(auVar54,local_318,auVar136);
              auVar54 = vfmadd231ps_avx512vl(auVar54,auVar37,auVar151);
              auVar106._8_8_ = auVar54._0_8_;
              auVar106._0_8_ = auVar54._0_8_;
              auVar54 = vshufpd_avx(auVar54,auVar54,3);
              auVar39 = vshufps_avx(auVar43,auVar43,0x55);
              auVar54 = vsubps_avx(auVar54,auVar106);
              auVar39 = vfmadd213ps_fma(auVar54,auVar39,auVar106);
              fVar206 = auVar39._0_4_;
              auVar54 = vshufps_avx(auVar39,auVar39,0x55);
              auVar107._0_4_ = auVar40._0_4_ * fVar206 + fVar223 * auVar54._0_4_;
              auVar107._4_4_ = auVar40._4_4_ * fVar206 + auVar38._4_4_ * auVar54._4_4_;
              auVar107._8_4_ = auVar40._8_4_ * fVar206 + auVar38._8_4_ * auVar54._8_4_;
              auVar107._12_4_ = auVar40._12_4_ * fVar206 + auVar38._12_4_ * auVar54._12_4_;
              auVar43 = vsubps_avx(auVar43,auVar107);
              auVar54 = vandps_avx512vl(auVar39,auVar259._0_16_);
              auVar39 = vprolq_avx512vl(auVar54,0x20);
              auVar54 = vmaxss_avx(auVar39,auVar54);
              bVar13 = auVar54._0_4_ <= (float)local_1f8._0_4_;
              if (auVar54._0_4_ < (float)local_1f8._0_4_) {
                auVar40 = vucomiss_avx512f(auVar41);
                if (bVar13) {
                  auVar38 = vucomiss_avx512f(auVar40);
                  auVar261 = ZEXT1664(auVar38);
                  if (bVar13) {
                    vmovshdup_avx(auVar40);
                    auVar38 = vucomiss_avx512f(auVar41);
                    if (bVar13) {
                      auVar53 = vucomiss_avx512f(auVar38);
                      auVar261 = ZEXT1664(auVar53);
                      if (bVar13) {
                        auVar54 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar59 = vinsertps_avx(auVar54,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar2 = (ray->org).field_0;
                        auVar54 = vsubps_avx(local_208,(undefined1  [16])aVar2);
                        auVar54 = vdpps_avx(auVar54,auVar59,0x7f);
                        auVar39 = vsubps_avx(local_218,(undefined1  [16])aVar2);
                        auVar39 = vdpps_avx(auVar39,auVar59,0x7f);
                        auVar56 = vsubps_avx(local_228,(undefined1  [16])aVar2);
                        auVar56 = vdpps_avx(auVar56,auVar59,0x7f);
                        auVar57 = vsubps_avx(local_238,(undefined1  [16])aVar2);
                        auVar57 = vdpps_avx(auVar57,auVar59,0x7f);
                        auVar58 = vsubps_avx(_local_248,(undefined1  [16])aVar2);
                        auVar58 = vdpps_avx(auVar58,auVar59,0x7f);
                        auVar60 = vsubps_avx(_local_258,(undefined1  [16])aVar2);
                        auVar60 = vdpps_avx(auVar60,auVar59,0x7f);
                        auVar36 = vsubps_avx(_local_268,(undefined1  [16])aVar2);
                        auVar36 = vdpps_avx(auVar36,auVar59,0x7f);
                        auVar42 = vsubps_avx(_local_278,(undefined1  [16])aVar2);
                        auVar59 = vdpps_avx(auVar42,auVar59,0x7f);
                        auVar42 = vsubss_avx512f(auVar53,auVar38);
                        fVar223 = auVar38._0_4_;
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar223)),auVar42,
                                                  auVar54);
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar223)),auVar42,
                                                  auVar39);
                        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * fVar223)),auVar42,
                                                  auVar56);
                        auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar59._0_4_)),auVar42,
                                                  auVar57);
                        auVar53 = vsubss_avx512f(auVar53,auVar40);
                        auVar165._0_4_ = auVar53._0_4_;
                        fVar223 = auVar165._0_4_ * auVar165._0_4_ * auVar165._0_4_;
                        fVar219 = auVar40._0_4_;
                        fVar206 = fVar219 * 3.0 * auVar165._0_4_ * auVar165._0_4_;
                        fVar218 = auVar165._0_4_ * fVar219 * fVar219 * 3.0;
                        fVar221 = fVar219 * fVar219 * fVar219;
                        auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * auVar56._0_4_)),
                                                  ZEXT416((uint)fVar218),auVar39);
                        auVar53 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar206),auVar54);
                        auVar38 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar223),auVar38);
                        fVar220 = auVar38._0_4_;
                        if (((ray->org).field_0.m128[3] <= fVar220) &&
                           (fVar222 = ray->tfar, fVar220 <= fVar222)) {
                          auVar38 = vshufps_avx(auVar40,auVar40,0x55);
                          auVar197._8_4_ = 0x3f800000;
                          auVar197._0_8_ = &DAT_3f8000003f800000;
                          auVar197._12_4_ = 0x3f800000;
                          auVar53 = vsubps_avx(auVar197,auVar38);
                          fVar167 = auVar38._0_4_;
                          auVar203._0_4_ = fVar167 * (float)local_248._0_4_;
                          fVar182 = auVar38._4_4_;
                          auVar203._4_4_ = fVar182 * (float)local_248._4_4_;
                          fVar183 = auVar38._8_4_;
                          auVar203._8_4_ = fVar183 * fStack_240;
                          fVar184 = auVar38._12_4_;
                          auVar203._12_4_ = fVar184 * fStack_23c;
                          auVar217._0_4_ = fVar167 * (float)local_258._0_4_;
                          auVar217._4_4_ = fVar182 * (float)local_258._4_4_;
                          auVar217._8_4_ = fVar183 * fStack_250;
                          auVar217._12_4_ = fVar184 * fStack_24c;
                          auVar230._0_4_ = fVar167 * (float)local_268._0_4_;
                          auVar230._4_4_ = fVar182 * (float)local_268._4_4_;
                          auVar230._8_4_ = fVar183 * fStack_260;
                          auVar230._12_4_ = fVar184 * fStack_25c;
                          auVar179._0_4_ = fVar167 * (float)local_278._0_4_;
                          auVar179._4_4_ = fVar182 * (float)local_278._4_4_;
                          auVar179._8_4_ = fVar183 * fStack_270;
                          auVar179._12_4_ = fVar184 * fStack_26c;
                          auVar38 = vfmadd231ps_fma(auVar203,auVar53,local_208);
                          auVar54 = vfmadd231ps_fma(auVar217,auVar53,local_218);
                          auVar39 = vfmadd231ps_fma(auVar230,auVar53,local_228);
                          auVar56 = vfmadd231ps_fma(auVar179,auVar53,local_238);
                          auVar38 = vsubps_avx(auVar54,auVar38);
                          auVar53 = vsubps_avx(auVar39,auVar54);
                          auVar54 = vsubps_avx(auVar56,auVar39);
                          auVar231._0_4_ = fVar219 * auVar53._0_4_;
                          auVar231._4_4_ = fVar219 * auVar53._4_4_;
                          auVar231._8_4_ = fVar219 * auVar53._8_4_;
                          auVar231._12_4_ = fVar219 * auVar53._12_4_;
                          auVar165._4_4_ = auVar165._0_4_;
                          auVar165._8_4_ = auVar165._0_4_;
                          auVar165._12_4_ = auVar165._0_4_;
                          auVar38 = vfmadd231ps_fma(auVar231,auVar165,auVar38);
                          auVar180._0_4_ = fVar219 * auVar54._0_4_;
                          auVar180._4_4_ = fVar219 * auVar54._4_4_;
                          auVar180._8_4_ = fVar219 * auVar54._8_4_;
                          auVar180._12_4_ = fVar219 * auVar54._12_4_;
                          auVar53 = vfmadd231ps_fma(auVar180,auVar165,auVar53);
                          auVar181._0_4_ = fVar219 * auVar53._0_4_;
                          auVar181._4_4_ = fVar219 * auVar53._4_4_;
                          auVar181._8_4_ = fVar219 * auVar53._8_4_;
                          auVar181._12_4_ = fVar219 * auVar53._12_4_;
                          auVar38 = vfmadd231ps_fma(auVar181,auVar165,auVar38);
                          auVar19._8_4_ = 0x40400000;
                          auVar19._0_8_ = 0x4040000040400000;
                          auVar19._12_4_ = 0x40400000;
                          auVar38 = vmulps_avx512vl(auVar38,auVar19);
                          pGVar7 = (context->scene->geometries).items[uVar33].ptr;
                          if ((pGVar7->mask & ray->mask) == 0) {
                            bVar13 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar13 = true,
                                  pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar152._0_4_ = fVar221 * (float)local_118._0_4_;
                            auVar152._4_4_ = fVar221 * (float)local_118._4_4_;
                            auVar152._8_4_ = fVar221 * fStack_110;
                            auVar152._12_4_ = fVar221 * fStack_10c;
                            auVar137._4_4_ = fVar218;
                            auVar137._0_4_ = fVar218;
                            auVar137._8_4_ = fVar218;
                            auVar137._12_4_ = fVar218;
                            auVar53 = vfmadd132ps_fma(auVar137,auVar152,local_108);
                            auVar126._4_4_ = fVar206;
                            auVar126._0_4_ = fVar206;
                            auVar126._8_4_ = fVar206;
                            auVar126._12_4_ = fVar206;
                            auVar53 = vfmadd132ps_fma(auVar126,auVar53,local_f8);
                            auVar118._4_4_ = fVar223;
                            auVar118._0_4_ = fVar223;
                            auVar118._8_4_ = fVar223;
                            auVar118._12_4_ = fVar223;
                            auVar39 = vfmadd132ps_fma(auVar118,auVar53,local_e8);
                            auVar53 = vshufps_avx(auVar39,auVar39,0xc9);
                            auVar54 = vshufps_avx(auVar38,auVar38,0xc9);
                            auVar119._0_4_ = auVar39._0_4_ * auVar54._0_4_;
                            auVar119._4_4_ = auVar39._4_4_ * auVar54._4_4_;
                            auVar119._8_4_ = auVar39._8_4_ * auVar54._8_4_;
                            auVar119._12_4_ = auVar39._12_4_ * auVar54._12_4_;
                            auVar53 = vfmsub231ps_fma(auVar119,auVar38,auVar53);
                            auVar38 = vshufps_avx(auVar53,auVar53,0xe9);
                            local_148 = vmovlps_avx(auVar38);
                            local_140 = auVar53._0_4_;
                            local_13c = vmovlps_avx(auVar40);
                            local_134 = (int)local_2b8;
                            local_130 = uVar33;
                            local_12c = context->user->instID[0];
                            local_128 = context->user->instPrimID[0];
                            ray->tfar = fVar220;
                            local_31c = -1;
                            local_2a8.valid = &local_31c;
                            local_2a8.geometryUserPtr = pGVar7->userPtr;
                            local_2a8.context = context->user;
                            local_2a8.hit = (RTCHitN *)&local_148;
                            local_2a8.N = 1;
                            local_2a8.ray = (RTCRayN *)ray;
                            if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c59194:
                              auVar40 = auVar263._0_16_;
                              p_Var12 = context->args->filter;
                              if (p_Var12 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var12)(&local_2a8);
                                  auVar256 = ZEXT1664(local_2d8);
                                  in_ZMM31 = ZEXT1664(local_2f8);
                                  auVar260 = ZEXT1664(local_2e8);
                                  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar258 = ZEXT3264(auVar79);
                                  auVar257 = ZEXT1664(local_318);
                                  auVar261 = ZEXT464(0x3f800000);
                                  auVar40 = vxorps_avx512vl(auVar40,auVar40);
                                  auVar263 = ZEXT1664(auVar40);
                                  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar259 = ZEXT1664(auVar40);
                                }
                                if (*local_2a8.valid == 0) goto LAB_01c592d5;
                              }
                              bVar13 = true;
                            }
                            else {
                              local_2c0 = lVar32;
                              (*pGVar7->occlusionFilterN)(&local_2a8);
                              auVar256 = ZEXT1664(local_2d8);
                              in_ZMM31 = ZEXT1664(local_2f8);
                              auVar260 = ZEXT1664(local_2e8);
                              auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar258 = ZEXT3264(auVar79);
                              auVar257 = ZEXT1664(local_318);
                              auVar261 = ZEXT464(0x3f800000);
                              auVar40 = vxorps_avx512vl(auVar41,auVar41);
                              auVar263 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar259 = ZEXT1664(auVar40);
                              lVar32 = local_2c0;
                              if (*local_2a8.valid != 0) goto LAB_01c59194;
LAB_01c592d5:
                              bVar13 = false;
                            }
                            if (!bVar13) {
                              ray->tfar = fVar222;
                            }
                          }
                          bVar34 = (bool)(bVar34 | bVar13);
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar30 = lVar30 + -1;
            } while (lVar30 != 0);
          }
        }
        else {
          auVar257 = ZEXT1664(local_318);
        }
      }
    } while (bVar16);
    auVar40 = vinsertps_avx(auVar50,auVar55,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }